

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86::forward(InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  _func_int *p_Var7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  void *pvVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int iVar17;
  uint uVar18;
  undefined1 (*pauVar19) [16];
  float *pfVar20;
  ulong uVar21;
  long lVar22;
  float *pfVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  float *pfVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  undefined1 (*pauVar33) [16];
  int iVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  int p_3;
  long lVar38;
  int p_4;
  float *pfVar39;
  bool bVar40;
  float fVar41;
  float fVar54;
  float fVar55;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar58;
  float fVar89;
  float fVar91;
  __m128 pos_4;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar93;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar90;
  float fVar92;
  float fVar94;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  __m128 pos;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar124;
  float fVar139;
  float fVar140;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar141;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  __m128 pos_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  __m128 pos_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  v4sf one;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  __m128 _a;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  __m128 _b;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float *local_d0;
  int *local_c8;
  size_t local_c0;
  int local_b8;
  Allocator *local_b0;
  int local_a8;
  int local_a4;
  undefined8 local_a0;
  int local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  Option opt_flatten;
  
  p_Var7 = this->_vptr_InnerProduct_x86[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0xdc + (long)p_Var7) != 0)) {
    iVar17 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar17;
  }
  local_a8 = bottom_blob->dims;
  if (local_a8 == 2) {
    local_a4 = bottom_blob->w;
    if (local_a4 ==
        *(int *)(&this->field_0xd8 + (long)p_Var7) / *(int *)(&this->field_0xd0 + (long)p_Var7)) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)p_Var7),bottom_blob->h,
                  bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var7 = this->_vptr_InnerProduct_x86[-3];
      iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var7);
      iVar5 = bottom_blob->w;
      uVar6 = top_blob->w;
      iVar30 = bottom_blob->elempack;
      bVar27 = (uVar6 & 3) == 0 & opt->use_packing_layout;
      uVar18 = 0;
      iVar31 = 0;
      if (0 < iVar5) {
        iVar31 = iVar5;
      }
      lVar8 = *(long *)(&this->field_0x178 + (long)p_Var7);
      uVar13 = (int)uVar6 >> 2;
      if ((int)uVar6 >> 2 < 1) {
        uVar13 = uVar18;
      }
      local_88 = (ulong)uVar13;
      if ((int)uVar6 < 1) {
        uVar6 = uVar18;
      }
      uVar13 = bottom_blob->h;
      if (bottom_blob->h < 1) {
        uVar13 = uVar18;
      }
      local_80 = (ulong)uVar13;
      uVar21 = 0;
      do {
        if (uVar21 == local_80) {
          return 0;
        }
        if ((iVar30 == 4 & bVar27) != 0) {
          pauVar19 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar21 * top_blob->elemsize + (long)top_blob->data);
          for (uVar25 = 0; uVar25 != local_88; uVar25 = uVar25 + 1) {
            if (lVar8 == 0) {
              auVar73 = ZEXT816(0);
            }
            else {
              auVar73 = *(undefined1 (*) [16])(lVar8 + uVar25 * 0x10);
            }
            lVar32 = bottom_blob->elemsize * uVar21 * (long)bottom_blob->w;
            pvVar9 = bottom_blob->data;
            lVar35 = 0;
            auVar125 = auVar73;
            auVar84 = auVar73;
            auVar97 = auVar73;
            iVar34 = iVar31;
            while( true ) {
              bVar40 = iVar34 == 0;
              iVar34 = iVar34 + -1;
              fVar58 = auVar97._0_4_;
              fVar124 = auVar84._0_4_;
              fVar41 = auVar125._0_4_;
              fVar57 = auVar73._0_4_;
              fVar90 = auVar97._4_4_;
              fVar94 = auVar97._12_4_;
              fVar139 = auVar84._4_4_;
              fVar141 = auVar84._12_4_;
              fVar54 = auVar125._4_4_;
              fVar56 = auVar125._12_4_;
              fVar89 = auVar73._4_4_;
              fVar91 = auVar73._8_4_;
              fVar93 = auVar73._12_4_;
              fVar92 = auVar97._8_4_;
              fVar140 = auVar84._8_4_;
              fVar55 = auVar125._8_4_;
              if (bVar40) break;
              fVar182 = *(float *)((long)pvVar9 + lVar35 + lVar32);
              fVar183 = *(float *)((long)pvVar9 + lVar35 + lVar32 + 4);
              fVar184 = *(float *)((long)pvVar9 + lVar35 + lVar32 + 8);
              fVar185 = *(float *)((long)pvVar9 + lVar35 + lVar32 + 0xc);
              pfVar28 = (float *)((long)(this->weight_data_tm).data +
                                 lVar35 + (this->weight_data_tm).elemsize * uVar25 *
                                          (long)(this->weight_data_tm).w);
              fVar186 = *pfVar28;
              fVar190 = pfVar28[1];
              fVar191 = pfVar28[2];
              fVar192 = pfVar28[3];
              auVar97._0_4_ = fVar58 + fVar182 * fVar186;
              auVar97._4_4_ = fVar90 + fVar182 * fVar190;
              auVar97._8_4_ = fVar92 + fVar182 * fVar191;
              auVar97._12_4_ = fVar94 + fVar182 * fVar192;
              auVar84._0_4_ = fVar124 + fVar183 * fVar186;
              auVar84._4_4_ = fVar139 + fVar183 * fVar190;
              auVar84._8_4_ = fVar140 + fVar183 * fVar191;
              auVar84._12_4_ = fVar141 + fVar183 * fVar192;
              auVar125._0_4_ = fVar41 + fVar184 * fVar186;
              auVar125._4_4_ = fVar54 + fVar184 * fVar190;
              auVar125._8_4_ = fVar55 + fVar184 * fVar191;
              auVar125._12_4_ = fVar56 + fVar184 * fVar192;
              auVar73._0_4_ = fVar57 + fVar185 * fVar186;
              auVar73._4_4_ = fVar89 + fVar185 * fVar190;
              auVar73._8_4_ = fVar91 + fVar185 * fVar191;
              auVar73._12_4_ = fVar93 + fVar185 * fVar192;
              lVar35 = lVar35 + 0x10;
            }
            auVar95 = auVar97;
            auVar142 = auVar84;
            auVar151 = auVar125;
            auVar170 = auVar73;
            if (5 < iVar17 - 1U) goto switchD_00275014_caseD_1;
            auVar95 = maxps(auVar97,ZEXT816(0));
            auVar142 = maxps(auVar84,ZEXT816(0));
            auVar151 = maxps(auVar125,ZEXT816(0));
            auVar170 = maxps(auVar73,ZEXT816(0));
            switch(iVar17) {
            case 2:
              auVar97 = minps(auVar97,ZEXT816(0));
              fVar57 = **(float **)(&this->field_0xe8 + (long)p_Var7);
              auVar96._0_4_ = auVar95._0_4_ + auVar97._0_4_ * fVar57;
              auVar96._4_4_ = auVar95._4_4_ + auVar97._4_4_ * fVar57;
              auVar96._8_4_ = auVar95._8_4_ + auVar97._8_4_ * fVar57;
              auVar96._12_4_ = auVar95._12_4_ + auVar97._12_4_ * fVar57;
              auVar84 = minps(auVar84,ZEXT816(0));
              auVar143._0_4_ = auVar142._0_4_ + auVar84._0_4_ * fVar57;
              auVar143._4_4_ = auVar142._4_4_ + auVar84._4_4_ * fVar57;
              auVar143._8_4_ = auVar142._8_4_ + auVar84._8_4_ * fVar57;
              auVar143._12_4_ = auVar142._12_4_ + auVar84._12_4_ * fVar57;
              auVar125 = minps(auVar125,ZEXT816(0));
              auVar152._0_4_ = auVar151._0_4_ + auVar125._0_4_ * fVar57;
              auVar152._4_4_ = auVar151._4_4_ + auVar125._4_4_ * fVar57;
              auVar152._8_4_ = auVar151._8_4_ + auVar125._8_4_ * fVar57;
              auVar152._12_4_ = auVar151._12_4_ + auVar125._12_4_ * fVar57;
              auVar73 = minps(auVar73,ZEXT816(0));
              auVar44._0_4_ = auVar73._0_4_ * fVar57;
              auVar44._4_4_ = auVar73._4_4_ * fVar57;
              auVar44._8_4_ = auVar73._8_4_ * fVar57;
              auVar44._12_4_ = auVar73._12_4_ * fVar57;
              goto LAB_00275d26;
            case 3:
              uVar3 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var7);
              uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var7))[1];
              auVar99._4_4_ = uVar3;
              auVar99._0_4_ = uVar3;
              auVar99._8_4_ = uVar3;
              auVar99._12_4_ = uVar3;
              auVar148._4_4_ = uVar2;
              auVar148._0_4_ = uVar2;
              auVar148._8_4_ = uVar2;
              auVar148._12_4_ = uVar2;
              auVar97 = maxps(auVar97,auVar99);
              auVar95 = minps(auVar97,auVar148);
              auVar84 = maxps(auVar84,auVar99);
              auVar142 = minps(auVar84,auVar148);
              auVar125 = maxps(auVar125,auVar99);
              auVar151 = minps(auVar125,auVar148);
              auVar73 = maxps(auVar73,auVar99);
              auVar170 = minps(auVar73,auVar148);
              break;
            case 4:
              auVar167._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
              auVar167._8_4_ = -fVar92;
              auVar167._12_4_ = -fVar94;
              auVar97 = minps(auVar167,_DAT_004f0400);
              auVar97 = maxps(auVar97,_DAT_004f0410);
              fVar124 = auVar97._0_4_ * 1.442695 + 0.5;
              fVar139 = auVar97._4_4_ * 1.442695 + 0.5;
              fVar58 = auVar97._8_4_ * 1.442695 + 0.5;
              fVar90 = auVar97._12_4_ * 1.442695 + 0.5;
              fVar57 = (float)(int)fVar124;
              fVar89 = (float)(int)fVar139;
              fVar41 = (float)(int)fVar58;
              fVar54 = (float)(int)fVar90;
              fVar57 = fVar57 - (float)(-(uint)(fVar124 < fVar57) & 0x3f800000);
              fVar89 = fVar89 - (float)(-(uint)(fVar139 < fVar89) & 0x3f800000);
              fVar41 = fVar41 - (float)(-(uint)(fVar58 < fVar41) & 0x3f800000);
              fVar54 = fVar54 - (float)(-(uint)(fVar90 < fVar54) & 0x3f800000);
              fVar124 = auVar97._0_4_ - fVar57 * 0.6931472;
              fVar139 = auVar97._4_4_ - fVar89 * 0.6931472;
              fVar58 = auVar97._8_4_ - fVar41 * 0.6931472;
              fVar90 = auVar97._12_4_ - fVar54 * 0.6931472;
              auVar159._0_4_ =
                   (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
                     0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5) * fVar124 * fVar124;
              auVar159._4_4_ =
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                     0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) * fVar139 * fVar139;
              auVar159._8_4_ =
                   (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                     0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) * fVar58 * fVar58;
              auVar159._12_4_ =
                   (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                     0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) * fVar90 * fVar90;
              auVar149._0_4_ =
                   (float)((int)fVar57 * 0x800000 + 0x3f800000) * (fVar124 + 1.0 + auVar159._0_4_) +
                   1.0;
              auVar149._4_4_ =
                   (float)((int)fVar89 * 0x800000 + 0x3f800000) * (fVar139 + 1.0 + auVar159._4_4_) +
                   1.0;
              auVar149._8_4_ =
                   (float)((int)fVar41 * 0x800000 + 0x3f800000) * (fVar58 + 1.0 + auVar159._8_4_) +
                   1.0;
              auVar149._12_4_ =
                   (float)((int)fVar54 * 0x800000 + 0x3f800000) * (fVar90 + 1.0 + auVar159._12_4_) +
                   1.0;
              auVar97 = rcpps(auVar159,auVar149);
              fVar57 = auVar97._0_4_;
              fVar89 = auVar97._4_4_;
              fVar41 = auVar97._8_4_;
              fVar54 = auVar97._12_4_;
              auVar96._0_4_ = (1.0 - auVar149._0_4_ * fVar57) * fVar57 + fVar57;
              auVar96._4_4_ = (1.0 - auVar149._4_4_ * fVar89) * fVar89 + fVar89;
              auVar96._8_4_ = (1.0 - auVar149._8_4_ * fVar41) * fVar41 + fVar41;
              auVar96._12_4_ = (1.0 - auVar149._12_4_ * fVar54) * fVar54 + fVar54;
              auVar130._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
              auVar130._8_4_ = -fVar140;
              auVar130._12_4_ = -fVar141;
              auVar84 = minps(auVar130,_DAT_004f0400);
              auVar84 = maxps(auVar84,_DAT_004f0410);
              fVar57 = auVar84._0_4_ * 1.442695 + 0.5;
              fVar89 = auVar84._4_4_ * 1.442695 + 0.5;
              fVar41 = auVar84._8_4_ * 1.442695 + 0.5;
              fVar54 = auVar84._12_4_ * 1.442695 + 0.5;
              fVar124 = (float)(int)fVar57;
              fVar139 = (float)(int)fVar89;
              fVar140 = (float)(int)fVar41;
              fVar141 = (float)(int)fVar54;
              fVar124 = fVar124 - (float)(-(uint)(fVar57 < fVar124) & 0x3f800000);
              fVar139 = fVar139 - (float)(-(uint)(fVar89 < fVar139) & 0x3f800000);
              fVar140 = fVar140 - (float)(-(uint)(fVar41 < fVar140) & 0x3f800000);
              fVar141 = fVar141 - (float)(-(uint)(fVar54 < fVar141) & 0x3f800000);
              fVar58 = (float)DAT_004f0450;
              fVar90 = DAT_004f0450._4_4_;
              fVar92 = DAT_004f0450._8_4_;
              fVar94 = DAT_004f0450._12_4_;
              fVar57 = auVar84._0_4_ - fVar124 * fVar58;
              fVar89 = auVar84._4_4_ - fVar139 * fVar90;
              fVar41 = auVar84._8_4_ - fVar140 * fVar92;
              fVar54 = auVar84._12_4_ - fVar141 * fVar94;
              auVar131._0_4_ =
                   fVar57 + 1.0 +
                   (((((fVar57 * 0.00019875691 + 0.0013981999) * fVar57 + 0.008333452) * fVar57 +
                     0.041665796) * fVar57 + 0.16666666) * fVar57 + 0.5) * fVar57 * fVar57;
              auVar131._4_4_ =
                   fVar89 + 1.0 +
                   (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                     0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5) * fVar89 * fVar89;
              auVar131._8_4_ =
                   fVar41 + 1.0 +
                   (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                     0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5) * fVar41 * fVar41;
              auVar131._12_4_ =
                   fVar54 + 1.0 +
                   (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                     0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5) * fVar54 * fVar54;
              auVar160._0_4_ = (float)((int)fVar124 * 0x800000 + 0x3f800000) * auVar131._0_4_ + 1.0;
              auVar160._4_4_ = (float)((int)fVar139 * 0x800000 + 0x3f800000) * auVar131._4_4_ + 1.0;
              auVar160._8_4_ = (float)((int)fVar140 * 0x800000 + 0x3f800000) * auVar131._8_4_ + 1.0;
              auVar160._12_4_ =
                   (float)((int)fVar141 * 0x800000 + 0x3f800000) * auVar131._12_4_ + 1.0;
              auVar84 = rcpps(auVar131,auVar160);
              fVar57 = auVar84._0_4_;
              fVar89 = auVar84._4_4_;
              fVar41 = auVar84._8_4_;
              fVar54 = auVar84._12_4_;
              auVar143._0_4_ = (1.0 - auVar160._0_4_ * fVar57) * fVar57 + fVar57;
              auVar143._4_4_ = (1.0 - auVar160._4_4_ * fVar89) * fVar89 + fVar89;
              auVar143._8_4_ = (1.0 - auVar160._8_4_ * fVar41) * fVar41 + fVar41;
              auVar143._12_4_ = (1.0 - auVar160._12_4_ * fVar54) * fVar54 + fVar54;
              auVar61._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
              auVar61._8_4_ = -fVar55;
              auVar61._12_4_ = -fVar56;
              auVar125 = minps(auVar61,_DAT_004f0400);
              auVar125 = maxps(auVar125,_DAT_004f0410);
              fVar57 = auVar125._0_4_ * 1.442695 + 0.5;
              fVar89 = auVar125._4_4_ * 1.442695 + 0.5;
              fVar41 = auVar125._8_4_ * 1.442695 + 0.5;
              fVar54 = auVar125._12_4_ * 1.442695 + 0.5;
              fVar55 = (float)(int)fVar57;
              fVar56 = (float)(int)fVar89;
              fVar124 = (float)(int)fVar41;
              fVar139 = (float)(int)fVar54;
              fVar55 = fVar55 - (float)(-(uint)(fVar57 < fVar55) & 0x3f800000);
              fVar56 = fVar56 - (float)(-(uint)(fVar89 < fVar56) & 0x3f800000);
              fVar124 = fVar124 - (float)(-(uint)(fVar41 < fVar124) & 0x3f800000);
              fVar139 = fVar139 - (float)(-(uint)(fVar54 < fVar139) & 0x3f800000);
              fVar57 = auVar125._0_4_ - fVar55 * fVar58;
              fVar89 = auVar125._4_4_ - fVar56 * fVar90;
              fVar41 = auVar125._8_4_ - fVar124 * fVar92;
              fVar54 = auVar125._12_4_ - fVar139 * fVar94;
              auVar62._0_4_ =
                   fVar57 + 1.0 +
                   (((((fVar57 * 0.00019875691 + 0.0013981999) * fVar57 + 0.008333452) * fVar57 +
                     0.041665796) * fVar57 + 0.16666666) * fVar57 + 0.5) * fVar57 * fVar57;
              auVar62._4_4_ =
                   fVar89 + 1.0 +
                   (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                     0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5) * fVar89 * fVar89;
              auVar62._8_4_ =
                   fVar41 + 1.0 +
                   (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                     0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5) * fVar41 * fVar41;
              auVar62._12_4_ =
                   fVar54 + 1.0 +
                   (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                     0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5) * fVar54 * fVar54;
              auVar168._0_4_ = (float)((int)fVar55 * 0x800000 + 0x3f800000) * auVar62._0_4_ + 1.0;
              auVar168._4_4_ = (float)((int)fVar56 * 0x800000 + 0x3f800000) * auVar62._4_4_ + 1.0;
              auVar168._8_4_ = (float)((int)fVar124 * 0x800000 + 0x3f800000) * auVar62._8_4_ + 1.0;
              auVar168._12_4_ = (float)((int)fVar139 * 0x800000 + 0x3f800000) * auVar62._12_4_ + 1.0
              ;
              auVar125 = rcpps(auVar62,auVar168);
              fVar57 = auVar125._0_4_;
              fVar89 = auVar125._4_4_;
              fVar41 = auVar125._8_4_;
              fVar54 = auVar125._12_4_;
              auVar152._0_4_ = (1.0 - auVar168._0_4_ * fVar57) * fVar57 + fVar57;
              auVar152._4_4_ = (1.0 - auVar168._4_4_ * fVar89) * fVar89 + fVar89;
              auVar152._8_4_ = (1.0 - auVar168._8_4_ * fVar41) * fVar41 + fVar41;
              auVar152._12_4_ = (1.0 - auVar168._12_4_ * fVar54) * fVar54 + fVar54;
              auVar42._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
              auVar42._8_4_ = -fVar91;
              auVar42._12_4_ = -fVar93;
              auVar73 = minps(auVar42,_DAT_004f0400);
              auVar73 = maxps(auVar73,_DAT_004f0410);
              fVar57 = auVar73._0_4_ * 1.442695 + 0.5;
              fVar89 = auVar73._4_4_ * 1.442695 + 0.5;
              fVar91 = auVar73._8_4_ * 1.442695 + 0.5;
              fVar93 = auVar73._12_4_ * 1.442695 + 0.5;
              fVar41 = (float)(int)fVar57;
              fVar54 = (float)(int)fVar89;
              fVar55 = (float)(int)fVar91;
              fVar56 = (float)(int)fVar93;
              fVar41 = fVar41 - (float)(-(uint)(fVar57 < fVar41) & 0x3f800000);
              fVar54 = fVar54 - (float)(-(uint)(fVar89 < fVar54) & 0x3f800000);
              fVar55 = fVar55 - (float)(-(uint)(fVar91 < fVar55) & 0x3f800000);
              fVar56 = fVar56 - (float)(-(uint)(fVar93 < fVar56) & 0x3f800000);
              fVar57 = auVar73._0_4_ - fVar41 * fVar58;
              fVar89 = auVar73._4_4_ - fVar54 * fVar90;
              fVar91 = auVar73._8_4_ - fVar55 * fVar92;
              fVar93 = auVar73._12_4_ - fVar56 * fVar94;
              auVar43._0_4_ =
                   fVar57 + 1.0 +
                   (((((fVar57 * 0.00019875691 + 0.0013981999) * fVar57 + 0.008333452) * fVar57 +
                     0.041665796) * fVar57 + 0.16666666) * fVar57 + 0.5) * fVar57 * fVar57;
              auVar43._4_4_ =
                   fVar89 + 1.0 +
                   (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                     0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5) * fVar89 * fVar89;
              auVar43._8_4_ =
                   fVar91 + 1.0 +
                   (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                     0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) * fVar91 * fVar91;
              auVar43._12_4_ =
                   fVar93 + 1.0 +
                   (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                     0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) * fVar93 * fVar93;
              auVar63._0_4_ = (float)((int)fVar41 * 0x800000 + 0x3f800000) * auVar43._0_4_ + 1.0;
              auVar63._4_4_ = (float)((int)fVar54 * 0x800000 + 0x3f800000) * auVar43._4_4_ + 1.0;
              auVar63._8_4_ = (float)((int)fVar55 * 0x800000 + 0x3f800000) * auVar43._8_4_ + 1.0;
              auVar63._12_4_ = (float)((int)fVar56 * 0x800000 + 0x3f800000) * auVar43._12_4_ + 1.0;
              auVar44 = rcpps(auVar43,auVar63);
              auVar170._0_4_ = (1.0 - auVar63._0_4_ * auVar44._0_4_) * auVar44._0_4_;
              auVar170._4_4_ = (1.0 - auVar63._4_4_ * auVar44._4_4_) * auVar44._4_4_;
              auVar170._8_4_ = (1.0 - auVar63._8_4_ * auVar44._8_4_) * auVar44._8_4_;
              auVar170._12_4_ = (1.0 - auVar63._12_4_ * auVar44._12_4_) * auVar44._12_4_;
LAB_00275d26:
              auVar171._0_4_ = auVar170._0_4_ + auVar44._0_4_;
              auVar171._4_4_ = auVar170._4_4_ + auVar44._4_4_;
              auVar171._8_4_ = auVar170._8_4_ + auVar44._8_4_;
              auVar171._12_4_ = auVar170._12_4_ + auVar44._12_4_;
              auVar95 = auVar96;
              auVar142 = auVar143;
              auVar151 = auVar152;
              auVar170 = auVar171;
              break;
            case 5:
              auVar97 = minps(auVar97,_DAT_004f0400);
              auVar97 = maxps(auVar97,_DAT_004f0410);
              fVar182 = auVar97._0_4_ * 1.442695 + 0.5;
              fVar183 = auVar97._4_4_ * 1.442695 + 0.5;
              fVar184 = auVar97._8_4_ * 1.442695 + 0.5;
              fVar185 = auVar97._12_4_ * 1.442695 + 0.5;
              fVar186 = (float)(int)fVar182;
              fVar190 = (float)(int)fVar183;
              fVar191 = (float)(int)fVar184;
              fVar192 = (float)(int)fVar185;
              fVar186 = fVar186 - (float)(-(uint)(fVar182 < fVar186) & 0x3f800000);
              fVar190 = fVar190 - (float)(-(uint)(fVar183 < fVar190) & 0x3f800000);
              fVar191 = fVar191 - (float)(-(uint)(fVar184 < fVar191) & 0x3f800000);
              fVar192 = fVar192 - (float)(-(uint)(fVar185 < fVar192) & 0x3f800000);
              fVar182 = auVar97._0_4_ - fVar186 * 0.6931472;
              fVar183 = auVar97._4_4_ - fVar190 * 0.6931472;
              fVar184 = auVar97._8_4_ - fVar191 * 0.6931472;
              fVar185 = auVar97._12_4_ - fVar192 * 0.6931472;
              auVar144._0_4_ =
                   (float)((int)fVar186 * 0x800000 + 0x3f800000) *
                   (fVar182 + 1.0 +
                   (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182 +
                     0.041665796) * fVar182 + 0.16666666) * fVar182 + 0.5) * fVar182 * fVar182) +
                   1.0;
              auVar144._4_4_ =
                   (float)((int)fVar190 * 0x800000 + 0x3f800000) *
                   (fVar183 + 1.0 +
                   (((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183 +
                     0.041665796) * fVar183 + 0.16666666) * fVar183 + 0.5) * fVar183 * fVar183) +
                   1.0;
              auVar144._8_4_ =
                   (float)((int)fVar191 * 0x800000 + 0x3f800000) *
                   (fVar184 + 1.0 +
                   (((((fVar184 * 0.00019875691 + 0.0013981999) * fVar184 + 0.008333452) * fVar184 +
                     0.041665796) * fVar184 + 0.16666666) * fVar184 + 0.5) * fVar184 * fVar184) +
                   1.0;
              auVar144._12_4_ =
                   (float)((int)fVar192 * 0x800000 + 0x3f800000) *
                   (fVar185 + 1.0 +
                   (((((fVar185 * 0.00019875691 + 0.0013981999) * fVar185 + 0.008333452) * fVar185 +
                     0.041665796) * fVar185 + 0.16666666) * fVar185 + 0.5) * fVar185 * fVar185) +
                   1.0;
              auVar97 = maxps(auVar144,_DAT_004f04b0);
              fVar182 = (float)(auVar97._0_4_ & 0x807fffff | 0x3f000000);
              fVar184 = (float)(auVar97._4_4_ & 0x807fffff | 0x3f000000);
              fVar186 = (float)(auVar97._8_4_ & 0x807fffff | 0x3f000000);
              fVar191 = (float)(auVar97._12_4_ & 0x807fffff | 0x3f000000);
              fVar183 = fVar182 + -1.0 + (float)(-(uint)(fVar182 < 0.70710677) & (uint)fVar182);
              fVar185 = fVar184 + -1.0 + (float)(-(uint)(fVar184 < 0.70710677) & (uint)fVar184);
              fVar190 = fVar186 + -1.0 + (float)(-(uint)(fVar186 < 0.70710677) & (uint)fVar186);
              fVar192 = fVar191 + -1.0 + (float)(-(uint)(fVar191 < 0.70710677) & (uint)fVar191);
              auVar145._0_8_ =
                   CONCAT44(-(uint)(auVar144._4_4_ <= 0.0),-(uint)(auVar144._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar145._8_4_ = -(uint)(auVar144._8_4_ <= 0.0) & 0x7fffffff;
              auVar145._12_4_ = -(uint)(auVar144._12_4_ <= 0.0) & 0x7fffffff;
              auVar98._0_4_ =
                   ~-(uint)(auVar144._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar97._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar182 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar183 +
                          (((((((((fVar183 * 0.070376836 + -0.1151461) * fVar183 + 0.116769984) *
                                 fVar183 + -0.12420141) * fVar183 + 0.14249323) * fVar183 +
                              -0.16668057) * fVar183 + 0.20000714) * fVar183 + -0.24999994) *
                            fVar183 + 0.3333333) * fVar183 + -0.5) * fVar183 * fVar183) * -2.0);
              auVar98._4_4_ =
                   ~-(uint)(auVar144._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar97._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar184 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar185 +
                          (((((((((fVar185 * 0.070376836 + -0.1151461) * fVar185 + 0.116769984) *
                                 fVar185 + -0.12420141) * fVar185 + 0.14249323) * fVar185 +
                              -0.16668057) * fVar185 + 0.20000714) * fVar185 + -0.24999994) *
                            fVar185 + 0.3333333) * fVar185 + -0.5) * fVar185 * fVar185) * -2.0);
              auVar98._8_4_ =
                   ~-(uint)(auVar144._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar97._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar186 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar190 +
                          (((((((((fVar190 * 0.070376836 + -0.1151461) * fVar190 + 0.116769984) *
                                 fVar190 + -0.12420141) * fVar190 + 0.14249323) * fVar190 +
                              -0.16668057) * fVar190 + 0.20000714) * fVar190 + -0.24999994) *
                            fVar190 + 0.3333333) * fVar190 + -0.5) * fVar190 * fVar190) * -2.0);
              auVar98._12_4_ =
                   ~-(uint)(auVar144._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar97._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar191 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar192 +
                          (((((((((fVar192 * 0.070376836 + -0.1151461) * fVar192 + 0.116769984) *
                                 fVar192 + -0.12420141) * fVar192 + 0.14249323) * fVar192 +
                              -0.16668057) * fVar192 + 0.20000714) * fVar192 + -0.24999994) *
                            fVar192 + 0.3333333) * fVar192 + -0.5) * fVar192 * fVar192) * -2.0);
              auVar97 = minps(auVar98 | auVar145,_DAT_004f0400);
              auVar97 = maxps(auVar97,_DAT_004f0410);
              fVar182 = auVar97._0_4_ * 1.442695 + 0.5;
              fVar183 = auVar97._4_4_ * 1.442695 + 0.5;
              fVar184 = auVar97._8_4_ * 1.442695 + 0.5;
              fVar185 = auVar97._12_4_ * 1.442695 + 0.5;
              fVar186 = (float)(int)fVar182;
              fVar190 = (float)(int)fVar183;
              fVar191 = (float)(int)fVar184;
              fVar192 = (float)(int)fVar185;
              fVar186 = fVar186 - (float)(-(uint)(fVar182 < fVar186) & 0x3f800000);
              fVar190 = fVar190 - (float)(-(uint)(fVar183 < fVar190) & 0x3f800000);
              fVar191 = fVar191 - (float)(-(uint)(fVar184 < fVar191) & 0x3f800000);
              fVar192 = fVar192 - (float)(-(uint)(fVar185 < fVar192) & 0x3f800000);
              fVar182 = auVar97._0_4_ - fVar186 * 0.6931472;
              fVar183 = auVar97._4_4_ - fVar190 * 0.6931472;
              fVar184 = auVar97._8_4_ - fVar191 * 0.6931472;
              fVar185 = auVar97._12_4_ - fVar192 * 0.6931472;
              auVar146._0_4_ = fVar182 * fVar182;
              auVar146._4_4_ = fVar183 * fVar183;
              auVar146._8_4_ = fVar184 * fVar184;
              auVar146._12_4_ = fVar185 * fVar185;
              auVar153._0_4_ =
                   (float)((int)fVar186 * 0x800000 + 0x3f800000) *
                   (fVar182 + 1.0 +
                   (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182 +
                     0.041665796) * fVar182 + 0.16666666) * fVar182 + 0.5) * auVar146._0_4_) + 1.0;
              auVar153._4_4_ =
                   (float)((int)fVar190 * 0x800000 + 0x3f800000) *
                   (fVar183 + 1.0 +
                   (((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183 +
                     0.041665796) * fVar183 + 0.16666666) * fVar183 + 0.5) * auVar146._4_4_) + 1.0;
              auVar153._8_4_ =
                   (float)((int)fVar191 * 0x800000 + 0x3f800000) *
                   (fVar184 + 1.0 +
                   (((((fVar184 * 0.00019875691 + 0.0013981999) * fVar184 + 0.008333452) * fVar184 +
                     0.041665796) * fVar184 + 0.16666666) * fVar184 + 0.5) * auVar146._8_4_) + 1.0;
              auVar153._12_4_ =
                   (float)((int)fVar192 * 0x800000 + 0x3f800000) *
                   (fVar185 + 1.0 +
                   (((((fVar185 * 0.00019875691 + 0.0013981999) * fVar185 + 0.008333452) * fVar185 +
                     0.041665796) * fVar185 + 0.16666666) * fVar185 + 0.5) * auVar146._12_4_) + 1.0;
              auVar97 = rcpps(auVar146,auVar153);
              fVar182 = auVar97._0_4_;
              fVar183 = auVar97._4_4_;
              fVar184 = auVar97._8_4_;
              fVar185 = auVar97._12_4_;
              auVar95._0_4_ =
                   (fVar182 + fVar182 + -1.0 +
                   (2.0 - auVar153._0_4_ * (fVar182 + fVar182)) * fVar182) * fVar58;
              auVar95._4_4_ =
                   (fVar183 + fVar183 + -1.0 +
                   (2.0 - auVar153._4_4_ * (fVar183 + fVar183)) * fVar183) * fVar90;
              auVar95._8_4_ =
                   (fVar184 + fVar184 + -1.0 +
                   (2.0 - auVar153._8_4_ * (fVar184 + fVar184)) * fVar184) * fVar92;
              auVar95._12_4_ =
                   (fVar185 + fVar185 + -1.0 +
                   (2.0 - auVar153._12_4_ * (fVar185 + fVar185)) * fVar185) * fVar94;
              auVar84 = minps(auVar84,_DAT_004f0400);
              auVar84 = maxps(auVar84,_DAT_004f0410);
              fVar58 = auVar84._0_4_ * 1.442695 + 0.5;
              fVar90 = auVar84._4_4_ * 1.442695 + 0.5;
              fVar92 = auVar84._8_4_ * 1.442695 + 0.5;
              fVar94 = auVar84._12_4_ * 1.442695 + 0.5;
              fVar182 = (float)(int)fVar58;
              fVar183 = (float)(int)fVar90;
              fVar184 = (float)(int)fVar92;
              fVar185 = (float)(int)fVar94;
              fVar182 = fVar182 - (float)(-(uint)(fVar58 < fVar182) & 0x3f800000);
              fVar183 = fVar183 - (float)(-(uint)(fVar90 < fVar183) & 0x3f800000);
              fVar184 = fVar184 - (float)(-(uint)(fVar92 < fVar184) & 0x3f800000);
              fVar185 = fVar185 - (float)(-(uint)(fVar94 < fVar185) & 0x3f800000);
              fVar58 = auVar84._0_4_ - fVar182 * 0.6931472;
              fVar90 = auVar84._4_4_ - fVar183 * 0.6931472;
              fVar92 = auVar84._8_4_ - fVar184 * 0.6931472;
              fVar94 = auVar84._12_4_ - fVar185 * 0.6931472;
              auVar154._0_4_ =
                   (float)((int)fVar182 * 0x800000 + 0x3f800000) *
                   (fVar58 + 1.0 +
                   (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                     0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) * fVar58 * fVar58) + 1.0;
              auVar154._4_4_ =
                   (float)((int)fVar183 * 0x800000 + 0x3f800000) *
                   (fVar90 + 1.0 +
                   (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                     0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) * fVar90 * fVar90) + 1.0;
              auVar154._8_4_ =
                   (float)((int)fVar184 * 0x800000 + 0x3f800000) *
                   (fVar92 + 1.0 +
                   (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                     0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5) * fVar92 * fVar92) + 1.0;
              auVar154._12_4_ =
                   (float)((int)fVar185 * 0x800000 + 0x3f800000) *
                   (fVar94 + 1.0 +
                   (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                     0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) * fVar94 * fVar94) + 1.0;
              auVar84 = maxps(auVar154,_DAT_004f04b0);
              fVar58 = (float)(auVar84._0_4_ & 0x807fffff | 0x3f000000);
              fVar92 = (float)(auVar84._4_4_ & 0x807fffff | 0x3f000000);
              fVar182 = (float)(auVar84._8_4_ & 0x807fffff | 0x3f000000);
              fVar184 = (float)(auVar84._12_4_ & 0x807fffff | 0x3f000000);
              fVar90 = fVar58 + -1.0 + (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar58);
              fVar94 = fVar92 + -1.0 + (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
              fVar183 = fVar182 + -1.0 + (float)(-(uint)(fVar182 < 0.70710677) & (uint)fVar182);
              fVar185 = fVar184 + -1.0 + (float)(-(uint)(fVar184 < 0.70710677) & (uint)fVar184);
              auVar155._0_8_ =
                   CONCAT44(-(uint)(auVar154._4_4_ <= 0.0),-(uint)(auVar154._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar155._8_4_ = -(uint)(auVar154._8_4_ <= 0.0) & 0x7fffffff;
              auVar155._12_4_ = -(uint)(auVar154._12_4_ <= 0.0) & 0x7fffffff;
              auVar147._0_4_ =
                   ~-(uint)(auVar154._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar84._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar58 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar90
                          + (((((((((fVar90 * 0.070376836 + -0.1151461) * fVar90 + 0.116769984) *
                                   fVar90 + -0.12420141) * fVar90 + 0.14249323) * fVar90 +
                                -0.16668057) * fVar90 + 0.20000714) * fVar90 + -0.24999994) * fVar90
                             + 0.3333333) * fVar90 + -0.5) * fVar90 * fVar90) * -2.0);
              auVar147._4_4_ =
                   ~-(uint)(auVar154._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar84._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar92 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar94
                          + (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 + 0.116769984) *
                                   fVar94 + -0.12420141) * fVar94 + 0.14249323) * fVar94 +
                                -0.16668057) * fVar94 + 0.20000714) * fVar94 + -0.24999994) * fVar94
                             + 0.3333333) * fVar94 + -0.5) * fVar94 * fVar94) * -2.0);
              auVar147._8_4_ =
                   ~-(uint)(auVar154._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar84._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar182 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar183 +
                          (((((((((fVar183 * 0.070376836 + -0.1151461) * fVar183 + 0.116769984) *
                                 fVar183 + -0.12420141) * fVar183 + 0.14249323) * fVar183 +
                              -0.16668057) * fVar183 + 0.20000714) * fVar183 + -0.24999994) *
                            fVar183 + 0.3333333) * fVar183 + -0.5) * fVar183 * fVar183) * -2.0);
              auVar147._12_4_ =
                   ~-(uint)(auVar154._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar84._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar184 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar185 +
                          (((((((((fVar185 * 0.070376836 + -0.1151461) * fVar185 + 0.116769984) *
                                 fVar185 + -0.12420141) * fVar185 + 0.14249323) * fVar185 +
                              -0.16668057) * fVar185 + 0.20000714) * fVar185 + -0.24999994) *
                            fVar185 + 0.3333333) * fVar185 + -0.5) * fVar185 * fVar185) * -2.0);
              auVar84 = minps(auVar147 | auVar155,_DAT_004f0400);
              auVar84 = maxps(auVar84,_DAT_004f0410);
              fVar58 = auVar84._0_4_ * 1.442695 + 0.5;
              fVar90 = auVar84._4_4_ * 1.442695 + 0.5;
              fVar92 = auVar84._8_4_ * 1.442695 + 0.5;
              fVar94 = auVar84._12_4_ * 1.442695 + 0.5;
              fVar182 = (float)(int)fVar58;
              fVar183 = (float)(int)fVar90;
              fVar184 = (float)(int)fVar92;
              fVar185 = (float)(int)fVar94;
              fVar182 = fVar182 - (float)(-(uint)(fVar58 < fVar182) & 0x3f800000);
              fVar183 = fVar183 - (float)(-(uint)(fVar90 < fVar183) & 0x3f800000);
              fVar184 = fVar184 - (float)(-(uint)(fVar92 < fVar184) & 0x3f800000);
              fVar185 = fVar185 - (float)(-(uint)(fVar94 < fVar185) & 0x3f800000);
              fVar58 = auVar84._0_4_ - fVar182 * 0.6931472;
              fVar90 = auVar84._4_4_ - fVar183 * 0.6931472;
              fVar92 = auVar84._8_4_ - fVar184 * 0.6931472;
              fVar94 = auVar84._12_4_ - fVar185 * 0.6931472;
              auVar156._0_4_ = fVar58 * fVar58;
              auVar156._4_4_ = fVar90 * fVar90;
              auVar156._8_4_ = fVar92 * fVar92;
              auVar156._12_4_ = fVar94 * fVar94;
              auVar164._0_4_ =
                   (float)((int)fVar182 * 0x800000 + 0x3f800000) *
                   (fVar58 + 1.0 +
                   (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                     0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) * auVar156._0_4_) + 1.0;
              auVar164._4_4_ =
                   (float)((int)fVar183 * 0x800000 + 0x3f800000) *
                   (fVar90 + 1.0 +
                   (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                     0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) * auVar156._4_4_) + 1.0;
              auVar164._8_4_ =
                   (float)((int)fVar184 * 0x800000 + 0x3f800000) *
                   (fVar92 + 1.0 +
                   (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                     0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5) * auVar156._8_4_) + 1.0;
              auVar164._12_4_ =
                   (float)((int)fVar185 * 0x800000 + 0x3f800000) *
                   (fVar94 + 1.0 +
                   (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                     0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) * auVar156._12_4_) + 1.0;
              auVar84 = rcpps(auVar156,auVar164);
              fVar58 = auVar84._0_4_;
              fVar90 = auVar84._4_4_;
              fVar92 = auVar84._8_4_;
              fVar94 = auVar84._12_4_;
              auVar142._0_4_ =
                   (fVar58 + fVar58 + -1.0 + (2.0 - auVar164._0_4_ * (fVar58 + fVar58)) * fVar58) *
                   fVar124;
              auVar142._4_4_ =
                   (fVar90 + fVar90 + -1.0 + (2.0 - auVar164._4_4_ * (fVar90 + fVar90)) * fVar90) *
                   fVar139;
              auVar142._8_4_ =
                   (fVar92 + fVar92 + -1.0 + (2.0 - auVar164._8_4_ * (fVar92 + fVar92)) * fVar92) *
                   fVar140;
              auVar142._12_4_ =
                   (fVar94 + fVar94 + -1.0 + (2.0 - auVar164._12_4_ * (fVar94 + fVar94)) * fVar94) *
                   fVar141;
              auVar125 = minps(auVar125,_DAT_004f0400);
              auVar125 = maxps(auVar125,_DAT_004f0410);
              fVar124 = auVar125._0_4_ * 1.442695 + 0.5;
              fVar139 = auVar125._4_4_ * 1.442695 + 0.5;
              fVar140 = auVar125._8_4_ * 1.442695 + 0.5;
              fVar141 = auVar125._12_4_ * 1.442695 + 0.5;
              fVar58 = (float)(int)fVar124;
              fVar90 = (float)(int)fVar139;
              fVar92 = (float)(int)fVar140;
              fVar94 = (float)(int)fVar141;
              fVar58 = fVar58 - (float)(-(uint)(fVar124 < fVar58) & 0x3f800000);
              fVar90 = fVar90 - (float)(-(uint)(fVar139 < fVar90) & 0x3f800000);
              fVar92 = fVar92 - (float)(-(uint)(fVar140 < fVar92) & 0x3f800000);
              fVar94 = fVar94 - (float)(-(uint)(fVar141 < fVar94) & 0x3f800000);
              fVar124 = auVar125._0_4_ - fVar58 * 0.6931472;
              fVar139 = auVar125._4_4_ - fVar90 * 0.6931472;
              fVar140 = auVar125._8_4_ - fVar92 * 0.6931472;
              fVar141 = auVar125._12_4_ - fVar94 * 0.6931472;
              auVar157._0_4_ =
                   (float)((int)fVar58 * 0x800000 + 0x3f800000) *
                   (fVar124 + 1.0 +
                   (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
                     0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5) * fVar124 * fVar124) +
                   1.0;
              auVar157._4_4_ =
                   (float)((int)fVar90 * 0x800000 + 0x3f800000) *
                   (fVar139 + 1.0 +
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                     0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) * fVar139 * fVar139) +
                   1.0;
              auVar157._8_4_ =
                   (float)((int)fVar92 * 0x800000 + 0x3f800000) *
                   (fVar140 + 1.0 +
                   (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                     0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5) * fVar140 * fVar140) +
                   1.0;
              auVar157._12_4_ =
                   (float)((int)fVar94 * 0x800000 + 0x3f800000) *
                   (fVar141 + 1.0 +
                   (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                     0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5) * fVar141 * fVar141) +
                   1.0;
              auVar125 = maxps(auVar157,_DAT_004f04b0);
              fVar124 = (float)(auVar125._0_4_ & 0x807fffff | 0x3f000000);
              fVar140 = (float)(auVar125._4_4_ & 0x807fffff | 0x3f000000);
              fVar58 = (float)(auVar125._8_4_ & 0x807fffff | 0x3f000000);
              fVar92 = (float)(auVar125._12_4_ & 0x807fffff | 0x3f000000);
              fVar139 = fVar124 + -1.0 + (float)(-(uint)(fVar124 < 0.70710677) & (uint)fVar124);
              fVar141 = fVar140 + -1.0 + (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
              fVar90 = fVar58 + -1.0 + (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar58);
              fVar94 = fVar92 + -1.0 + (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
              auVar158._0_8_ =
                   CONCAT44(-(uint)(auVar157._4_4_ <= 0.0),-(uint)(auVar157._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar158._8_4_ = -(uint)(auVar157._8_4_ <= 0.0) & 0x7fffffff;
              auVar158._12_4_ = -(uint)(auVar157._12_4_ <= 0.0) & 0x7fffffff;
              auVar126._0_4_ =
                   ~-(uint)(auVar157._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar125._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar124 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar139 +
                          (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) *
                                 fVar139 + -0.12420141) * fVar139 + 0.14249323) * fVar139 +
                              -0.16668057) * fVar139 + 0.20000714) * fVar139 + -0.24999994) *
                            fVar139 + 0.3333333) * fVar139 + -0.5) * fVar139 * fVar139) * -2.0);
              auVar126._4_4_ =
                   ~-(uint)(auVar157._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar125._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar140 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar141 +
                          (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) *
                                 fVar141 + -0.12420141) * fVar141 + 0.14249323) * fVar141 +
                              -0.16668057) * fVar141 + 0.20000714) * fVar141 + -0.24999994) *
                            fVar141 + 0.3333333) * fVar141 + -0.5) * fVar141 * fVar141) * -2.0);
              auVar126._8_4_ =
                   ~-(uint)(auVar157._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar125._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar58 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar90
                          + (((((((((fVar90 * 0.070376836 + -0.1151461) * fVar90 + 0.116769984) *
                                   fVar90 + -0.12420141) * fVar90 + 0.14249323) * fVar90 +
                                -0.16668057) * fVar90 + 0.20000714) * fVar90 + -0.24999994) * fVar90
                             + 0.3333333) * fVar90 + -0.5) * fVar90 * fVar90) * -2.0);
              auVar126._12_4_ =
                   ~-(uint)(auVar157._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar125._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar92 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar94
                          + (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 + 0.116769984) *
                                   fVar94 + -0.12420141) * fVar94 + 0.14249323) * fVar94 +
                                -0.16668057) * fVar94 + 0.20000714) * fVar94 + -0.24999994) * fVar94
                             + 0.3333333) * fVar94 + -0.5) * fVar94 * fVar94) * -2.0);
              auVar125 = minps(auVar126 | auVar158,_DAT_004f0400);
              auVar125 = maxps(auVar125,_DAT_004f0410);
              fVar124 = auVar125._0_4_ * 1.442695 + 0.5;
              fVar139 = auVar125._4_4_ * 1.442695 + 0.5;
              fVar140 = auVar125._8_4_ * 1.442695 + 0.5;
              fVar141 = auVar125._12_4_ * 1.442695 + 0.5;
              fVar58 = (float)(int)fVar124;
              fVar90 = (float)(int)fVar139;
              fVar92 = (float)(int)fVar140;
              fVar94 = (float)(int)fVar141;
              fVar58 = fVar58 - (float)(-(uint)(fVar124 < fVar58) & 0x3f800000);
              fVar90 = fVar90 - (float)(-(uint)(fVar139 < fVar90) & 0x3f800000);
              fVar92 = fVar92 - (float)(-(uint)(fVar140 < fVar92) & 0x3f800000);
              fVar94 = fVar94 - (float)(-(uint)(fVar141 < fVar94) & 0x3f800000);
              fVar124 = auVar125._0_4_ - fVar58 * 0.6931472;
              fVar139 = auVar125._4_4_ - fVar90 * 0.6931472;
              fVar140 = auVar125._8_4_ - fVar92 * 0.6931472;
              fVar141 = auVar125._12_4_ - fVar94 * 0.6931472;
              auVar127._0_4_ =
                   fVar124 + 1.0 +
                   (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
                     (float)DAT_004f0490) * fVar124 + 0.16666666) * fVar124 + 0.5) *
                   fVar124 * fVar124;
              auVar127._4_4_ =
                   fVar139 + 1.0 +
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                     DAT_004f0490._4_4_) * fVar139 + 0.16666666) * fVar139 + 0.5) *
                   fVar139 * fVar139;
              auVar127._8_4_ =
                   fVar140 + 1.0 +
                   (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                     DAT_004f0490._8_4_) * fVar140 + 0.16666666) * fVar140 + 0.5) *
                   fVar140 * fVar140;
              auVar127._12_4_ =
                   fVar141 + 1.0 +
                   (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                     DAT_004f0490._12_4_) * fVar141 + 0.16666666) * fVar141 + 0.5) *
                   fVar141 * fVar141;
              auVar165._0_4_ = (float)((int)fVar58 * 0x800000 + 0x3f800000) * auVar127._0_4_ + 1.0;
              auVar165._4_4_ = (float)((int)fVar90 * 0x800000 + 0x3f800000) * auVar127._4_4_ + 1.0;
              auVar165._8_4_ = (float)((int)fVar92 * 0x800000 + 0x3f800000) * auVar127._8_4_ + 1.0;
              auVar165._12_4_ = (float)((int)fVar94 * 0x800000 + 0x3f800000) * auVar127._12_4_ + 1.0
              ;
              auVar125 = rcpps(auVar127,auVar165);
              fVar124 = auVar125._0_4_;
              fVar139 = auVar125._4_4_;
              fVar140 = auVar125._8_4_;
              fVar141 = auVar125._12_4_;
              auVar151._0_4_ =
                   (fVar124 + fVar124 + -1.0 +
                   (2.0 - auVar165._0_4_ * (fVar124 + fVar124)) * fVar124) * fVar41;
              auVar151._4_4_ =
                   (fVar139 + fVar139 + -1.0 +
                   (2.0 - auVar165._4_4_ * (fVar139 + fVar139)) * fVar139) * fVar54;
              auVar151._8_4_ =
                   (fVar140 + fVar140 + -1.0 +
                   (2.0 - auVar165._8_4_ * (fVar140 + fVar140)) * fVar140) * fVar55;
              auVar151._12_4_ =
                   (fVar141 + fVar141 + -1.0 +
                   (2.0 - auVar165._12_4_ * (fVar141 + fVar141)) * fVar141) * fVar56;
              auVar73 = minps(auVar73,_DAT_004f0400);
              auVar73 = maxps(auVar73,_DAT_004f0410);
              fVar41 = auVar73._0_4_ * 1.442695 + 0.5;
              fVar54 = auVar73._4_4_ * 1.442695 + 0.5;
              fVar55 = auVar73._8_4_ * 1.442695 + 0.5;
              fVar56 = auVar73._12_4_ * 1.442695 + 0.5;
              fVar124 = (float)(int)fVar41;
              fVar139 = (float)(int)fVar54;
              fVar140 = (float)(int)fVar55;
              fVar141 = (float)(int)fVar56;
              fVar124 = fVar124 - (float)(-(uint)(fVar41 < fVar124) & 0x3f800000);
              fVar139 = fVar139 - (float)(-(uint)(fVar54 < fVar139) & 0x3f800000);
              fVar140 = fVar140 - (float)(-(uint)(fVar55 < fVar140) & 0x3f800000);
              fVar141 = fVar141 - (float)(-(uint)(fVar56 < fVar141) & 0x3f800000);
              fVar41 = auVar73._0_4_ - fVar124 * 0.6931472;
              fVar54 = auVar73._4_4_ - fVar139 * 0.6931472;
              fVar55 = auVar73._8_4_ - fVar140 * 0.6931472;
              fVar56 = auVar73._12_4_ - fVar141 * 0.6931472;
              auVar128._0_4_ =
                   (float)((int)fVar124 * 0x800000 + 0x3f800000) *
                   (fVar41 + 1.0 +
                   (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                     (float)DAT_004f0490) * fVar41 + 0.16666666) * fVar41 + 0.5) * fVar41 * fVar41)
                   + 1.0;
              auVar128._4_4_ =
                   (float)((int)fVar139 * 0x800000 + 0x3f800000) *
                   (fVar54 + 1.0 +
                   (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                     DAT_004f0490._4_4_) * fVar54 + 0.16666666) * fVar54 + 0.5) * fVar54 * fVar54) +
                   1.0;
              auVar128._8_4_ =
                   (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                   (fVar55 + 1.0 +
                   (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                     DAT_004f0490._8_4_) * fVar55 + 0.16666666) * fVar55 + 0.5) * fVar55 * fVar55) +
                   1.0;
              auVar128._12_4_ =
                   (float)((int)fVar141 * 0x800000 + 0x3f800000) *
                   (fVar56 + 1.0 +
                   (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                     DAT_004f0490._12_4_) * fVar56 + 0.16666666) * fVar56 + 0.5) * fVar56 * fVar56)
                   + 1.0;
              auVar73 = maxps(auVar128,_DAT_004f04b0);
              fVar41 = (float)(auVar73._0_4_ & 0x807fffff | 0x3f000000);
              fVar55 = (float)(auVar73._4_4_ & 0x807fffff | 0x3f000000);
              fVar124 = (float)(auVar73._8_4_ & 0x807fffff | 0x3f000000);
              fVar140 = (float)(auVar73._12_4_ & 0x807fffff | 0x3f000000);
              fVar54 = fVar41 + (float)DAT_004f04f0 +
                       (float)(-(uint)(fVar41 < 0.70710677) & (uint)fVar41);
              fVar56 = fVar55 + DAT_004f04f0._4_4_ +
                       (float)(-(uint)(fVar55 < 0.70710677) & (uint)fVar55);
              fVar139 = fVar124 + DAT_004f04f0._8_4_ +
                        (float)(-(uint)(fVar124 < 0.70710677) & (uint)fVar124);
              fVar141 = fVar140 + DAT_004f04f0._12_4_ +
                        (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
              auVar129._0_8_ =
                   CONCAT44(-(uint)(auVar128._4_4_ <= 0.0),-(uint)(auVar128._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar129._8_4_ = -(uint)(auVar128._8_4_ <= 0.0) & 0x7fffffff;
              auVar129._12_4_ = -(uint)(auVar128._12_4_ <= 0.0) & 0x7fffffff;
              auVar59._0_4_ =
                   ~-(uint)(auVar128._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar41 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar54
                          + (((((((((fVar54 * 0.070376836 + -0.1151461) * fVar54 + 0.116769984) *
                                   fVar54 + -0.12420141) * fVar54 + 0.14249323) * fVar54 +
                                -0.16668057) * fVar54 + 0.20000714) * fVar54 + -0.24999994) * fVar54
                             + 0.3333333) * fVar54 + -0.5) * fVar54 * fVar54) * -2.0);
              auVar59._4_4_ =
                   ~-(uint)(auVar128._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar55 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar56
                          + (((((((((fVar56 * 0.070376836 + -0.1151461) * fVar56 + 0.116769984) *
                                   fVar56 + -0.12420141) * fVar56 + 0.14249323) * fVar56 +
                                -0.16668057) * fVar56 + 0.20000714) * fVar56 + -0.24999994) * fVar56
                             + 0.3333333) * fVar56 + -0.5) * fVar56 * fVar56) * -2.0);
              auVar59._8_4_ =
                   ~-(uint)(auVar128._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar124 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar139 +
                          (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) *
                                 fVar139 + -0.12420141) * fVar139 + 0.14249323) * fVar139 +
                              -0.16668057) * fVar139 + 0.20000714) * fVar139 + -0.24999994) *
                            fVar139 + 0.3333333) * fVar139 + -0.5) * fVar139 * fVar139) * -2.0);
              auVar59._12_4_ =
                   ~-(uint)(auVar128._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar140 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar141 +
                          (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) *
                                 fVar141 + -0.12420141) * fVar141 + 0.14249323) * fVar141 +
                              -0.16668057) * fVar141 + 0.20000714) * fVar141 + -0.24999994) *
                            fVar141 + 0.3333333) * fVar141 + -0.5) * fVar141 * fVar141) * -2.0);
              auVar73 = minps(auVar59 | auVar129,_DAT_004f0400);
              auVar73 = maxps(auVar73,_DAT_004f0410);
              fVar41 = auVar73._0_4_ * 1.442695 + 0.5;
              fVar54 = auVar73._4_4_ * 1.442695 + 0.5;
              fVar55 = auVar73._8_4_ * 1.442695 + 0.5;
              fVar56 = auVar73._12_4_ * 1.442695 + 0.5;
              fVar124 = (float)(int)fVar41;
              fVar139 = (float)(int)fVar54;
              fVar140 = (float)(int)fVar55;
              fVar141 = (float)(int)fVar56;
              fVar124 = fVar124 - (float)(-(uint)(fVar41 < fVar124) & 0x3f800000);
              fVar139 = fVar139 - (float)(-(uint)(fVar54 < fVar139) & 0x3f800000);
              fVar140 = fVar140 - (float)(-(uint)(fVar55 < fVar140) & 0x3f800000);
              fVar141 = fVar141 - (float)(-(uint)(fVar56 < fVar141) & 0x3f800000);
              fVar41 = auVar73._0_4_ - fVar124 * 0.6931472;
              fVar54 = auVar73._4_4_ - fVar139 * 0.6931472;
              fVar55 = auVar73._8_4_ - fVar140 * 0.6931472;
              fVar56 = auVar73._12_4_ - fVar141 * 0.6931472;
              auVar60._0_4_ =
                   fVar41 + 1.0 +
                   (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                     0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5) * fVar41 * fVar41;
              auVar60._4_4_ =
                   fVar54 + 1.0 +
                   (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                     0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5) * fVar54 * fVar54;
              auVar60._8_4_ =
                   fVar55 + 1.0 +
                   (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                     0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5) * fVar55 * fVar55;
              auVar60._12_4_ =
                   fVar56 + 1.0 +
                   (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                     0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5) * fVar56 * fVar56;
              auVar166._0_4_ = (float)((int)fVar124 * 0x800000 + 0x3f800000) * auVar60._0_4_ + 1.0;
              auVar166._4_4_ = (float)((int)fVar139 * 0x800000 + 0x3f800000) * auVar60._4_4_ + 1.0;
              auVar166._8_4_ = (float)((int)fVar140 * 0x800000 + 0x3f800000) * auVar60._8_4_ + 1.0;
              auVar166._12_4_ = (float)((int)fVar141 * 0x800000 + 0x3f800000) * auVar60._12_4_ + 1.0
              ;
              auVar73 = rcpps(auVar60,auVar166);
              fVar41 = auVar73._0_4_;
              fVar54 = auVar73._4_4_;
              fVar55 = auVar73._8_4_;
              fVar56 = auVar73._12_4_;
              auVar173._0_4_ =
                   fVar41 + fVar41 + (float)DAT_004f04f0 +
                   (2.0 - auVar166._0_4_ * (fVar41 + fVar41)) * fVar41;
              auVar173._4_4_ =
                   fVar54 + fVar54 + DAT_004f04f0._4_4_ +
                   (2.0 - auVar166._4_4_ * (fVar54 + fVar54)) * fVar54;
              auVar173._8_4_ =
                   fVar55 + fVar55 + DAT_004f04f0._8_4_ +
                   (2.0 - auVar166._8_4_ * (fVar55 + fVar55)) * fVar55;
              auVar173._12_4_ =
                   fVar56 + fVar56 + DAT_004f04f0._12_4_ +
                   (2.0 - auVar166._12_4_ * (fVar56 + fVar56)) * fVar56;
              goto LAB_00275d9f;
            case 6:
              fVar182 = **(float **)(&this->field_0xe8 + (long)p_Var7);
              fVar183 = (*(float **)(&this->field_0xe8 + (long)p_Var7))[1];
              auVar100._0_4_ = fVar182 * fVar58 + fVar183;
              auVar100._4_4_ = fVar182 * fVar90 + fVar183;
              auVar100._8_4_ = fVar182 * fVar92 + fVar183;
              auVar100._12_4_ = fVar182 * fVar94 + fVar183;
              auVar73 = maxps(auVar100,ZEXT816(0));
              auVar73 = minps(auVar73,_DAT_004f0440);
              auVar95._0_4_ = auVar73._0_4_ * fVar58;
              auVar95._4_4_ = auVar73._4_4_ * fVar90;
              auVar95._8_4_ = auVar73._8_4_ * fVar92;
              auVar95._12_4_ = auVar73._12_4_ * fVar94;
              auVar150._0_4_ = fVar182 * fVar124 + fVar183;
              auVar150._4_4_ = fVar182 * fVar139 + fVar183;
              auVar150._8_4_ = fVar182 * fVar140 + fVar183;
              auVar150._12_4_ = fVar182 * fVar141 + fVar183;
              auVar73 = maxps(auVar150,ZEXT816(0));
              auVar73 = minps(auVar73,_DAT_004f0440);
              auVar142._0_4_ = auVar73._0_4_ * fVar124;
              auVar142._4_4_ = auVar73._4_4_ * fVar139;
              auVar142._8_4_ = auVar73._8_4_ * fVar140;
              auVar142._12_4_ = auVar73._12_4_ * fVar141;
              auVar161._0_4_ = fVar182 * fVar41 + fVar183;
              auVar161._4_4_ = fVar182 * fVar54 + fVar183;
              auVar161._8_4_ = fVar182 * fVar55 + fVar183;
              auVar161._12_4_ = fVar182 * fVar56 + fVar183;
              auVar73 = maxps(auVar161,ZEXT816(0));
              auVar73 = minps(auVar73,_DAT_004f0440);
              auVar151._0_4_ = auVar73._0_4_ * fVar41;
              auVar151._4_4_ = auVar73._4_4_ * fVar54;
              auVar151._8_4_ = auVar73._8_4_ * fVar55;
              auVar151._12_4_ = auVar73._12_4_ * fVar56;
              auVar172._0_4_ = fVar182 * fVar57 + fVar183;
              auVar172._4_4_ = fVar182 * fVar89 + fVar183;
              auVar172._8_4_ = fVar182 * fVar91 + fVar183;
              auVar172._12_4_ = fVar182 * fVar93 + fVar183;
              auVar73 = maxps(auVar172,ZEXT816(0));
              auVar173 = minps(auVar73,_DAT_004f0440);
LAB_00275d9f:
              auVar170._0_4_ = auVar173._0_4_ * fVar57;
              auVar170._4_4_ = auVar173._4_4_ * fVar89;
              auVar170._8_4_ = auVar173._8_4_ * fVar91;
              auVar170._12_4_ = auVar173._12_4_ * fVar93;
            }
switchD_00275014_caseD_1:
            auVar45._0_8_ = auVar95._0_8_;
            auVar45._8_4_ = auVar95._4_4_;
            auVar45._12_4_ = auVar142._4_4_;
            auVar64._0_8_ = auVar151._0_8_;
            auVar64._8_4_ = auVar151._4_4_;
            auVar64._12_4_ = auVar170._4_4_;
            auVar65._8_8_ = auVar64._8_8_;
            auVar132._12_4_ = auVar170._0_4_;
            auVar132._8_4_ = auVar151._0_4_;
            auVar101._0_8_ = CONCAT44(auVar142._8_4_,auVar95._8_4_);
            auVar101._8_4_ = auVar95._12_4_;
            auVar101._12_4_ = auVar142._12_4_;
            auVar162._0_8_ = CONCAT44(auVar170._8_4_,auVar151._8_4_);
            auVar162._8_4_ = auVar151._12_4_;
            auVar162._12_4_ = auVar170._12_4_;
            auVar132._4_4_ = auVar142._0_4_;
            auVar132._0_4_ = auVar95._0_4_;
            auVar65._0_8_ = auVar45._8_8_;
            auVar46._8_8_ = auVar162._0_8_;
            auVar46._0_8_ = auVar101._0_8_;
            auVar163._8_8_ = auVar162._8_8_;
            auVar163._0_8_ = auVar101._8_8_;
            *pauVar19 = auVar132;
            pauVar19[1] = auVar65;
            pauVar19[2] = auVar46;
            pauVar19[3] = auVar163;
            pauVar19 = pauVar19 + 4;
          }
        }
        if ((iVar30 == 1 & bVar27) != 0) {
          pauVar19 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar21 * top_blob->elemsize + (long)top_blob->data);
          for (uVar25 = 0; uVar25 != local_88; uVar25 = uVar25 + 1) {
            if (lVar8 == 0) {
              auVar47 = ZEXT816(0);
            }
            else {
              auVar47 = *(undefined1 (*) [16])(lVar8 + uVar25 * 0x10);
            }
            pfVar28 = (float *)((long)(this->weight_data_tm).w * uVar25 *
                                (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data)
            ;
            lVar32 = 0;
            while( true ) {
              fVar57 = auVar47._0_4_;
              fVar89 = auVar47._4_4_;
              fVar91 = auVar47._8_4_;
              fVar93 = auVar47._12_4_;
              if (iVar31 == (int)lVar32) break;
              fVar41 = *(float *)((long)bottom_blob->data +
                                 lVar32 * 4 + bottom_blob->elemsize * uVar21 * (long)bottom_blob->w)
              ;
              auVar47._0_4_ = fVar57 + *pfVar28 * fVar41;
              auVar47._4_4_ = fVar89 + pfVar28[1] * fVar41;
              auVar47._8_4_ = fVar91 + pfVar28[2] * fVar41;
              auVar47._12_4_ = fVar93 + pfVar28[3] * fVar41;
              pfVar28 = pfVar28 + 4;
              lVar32 = lVar32 + 1;
            }
            auVar66 = auVar47;
            if (5 < iVar17 - 1U) goto switchD_00275e9d_caseD_1;
            auVar66 = maxps(auVar47,ZEXT816(0));
            fVar41 = (float)DAT_004f0430;
            fVar54 = DAT_004f0430._4_4_;
            fVar55 = DAT_004f0430._8_4_;
            fVar56 = DAT_004f0430._12_4_;
            switch(iVar17) {
            case 2:
              auVar73 = minps(auVar47,ZEXT816(0));
              fVar57 = **(float **)(&this->field_0xe8 + (long)p_Var7);
              auVar67._0_4_ = auVar66._0_4_ + fVar57 * auVar73._0_4_;
              auVar67._4_4_ = auVar66._4_4_ + fVar57 * auVar73._4_4_;
              auVar67._8_4_ = auVar66._8_4_ + fVar57 * auVar73._8_4_;
              auVar67._12_4_ = auVar66._12_4_ + fVar57 * auVar73._12_4_;
              auVar66 = auVar67;
              break;
            case 3:
              uVar3 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var7);
              uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var7))[1];
              auVar69._4_4_ = uVar3;
              auVar69._0_4_ = uVar3;
              auVar69._8_4_ = uVar3;
              auVar69._12_4_ = uVar3;
              auVar106._4_4_ = uVar2;
              auVar106._0_4_ = uVar2;
              auVar106._8_4_ = uVar2;
              auVar106._12_4_ = uVar2;
              auVar73 = maxps(auVar47,auVar69);
              auVar66 = minps(auVar73,auVar106);
              break;
            case 4:
              auVar48._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
              auVar48._8_4_ = -fVar91;
              auVar48._12_4_ = -fVar93;
              auVar73 = minps(auVar48,_DAT_004f0400);
              auVar73 = maxps(auVar73,_DAT_004f0410);
              fVar89 = auVar73._0_4_ * 1.442695 + fVar41;
              fVar93 = auVar73._4_4_ * 1.442695 + fVar54;
              fVar139 = auVar73._8_4_ * 1.442695 + fVar55;
              fVar141 = auVar73._12_4_ * 1.442695 + fVar56;
              fVar57 = (float)(int)fVar89;
              fVar91 = (float)(int)fVar93;
              fVar124 = (float)(int)fVar139;
              fVar140 = (float)(int)fVar141;
              fVar58 = (float)DAT_004f0440;
              fVar90 = DAT_004f0440._4_4_;
              fVar92 = DAT_004f0440._8_4_;
              fVar94 = DAT_004f0440._12_4_;
              fVar57 = fVar57 - (float)(-(uint)(fVar89 < fVar57) & (uint)fVar58);
              fVar91 = fVar91 - (float)(-(uint)(fVar93 < fVar91) & (uint)fVar90);
              fVar124 = fVar124 - (float)(-(uint)(fVar139 < fVar124) & (uint)fVar92);
              fVar140 = fVar140 - (float)(-(uint)(fVar141 < fVar140) & (uint)fVar94);
              fVar89 = fVar57 * -0.6931472 + auVar73._0_4_;
              fVar93 = fVar91 * -0.6931472 + auVar73._4_4_;
              fVar139 = fVar124 * -0.6931472 + auVar73._8_4_;
              fVar141 = fVar140 * -0.6931472 + auVar73._12_4_;
              auVar49._0_4_ = fVar89 * fVar89;
              auVar49._4_4_ = fVar93 * fVar93;
              auVar49._8_4_ = fVar139 * fVar139;
              auVar49._12_4_ = fVar141 * fVar141;
              auVar107._0_4_ =
                   (float)((int)fVar57 * 0x800000 + (int)fVar58) *
                   (fVar89 + fVar58 +
                   (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                     0.041665796) * fVar89 + 0.16666666) * fVar89 + fVar41) * auVar49._0_4_) +
                   fVar58;
              auVar107._4_4_ =
                   (float)((int)fVar91 * 0x800000 + (int)fVar90) *
                   (fVar93 + fVar90 +
                   (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                     0.041665796) * fVar93 + 0.16666666) * fVar93 + fVar54) * auVar49._4_4_) +
                   fVar90;
              auVar107._8_4_ =
                   (float)((int)fVar124 * 0x800000 + (int)fVar92) *
                   (fVar139 + fVar92 +
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                     0.041665796) * fVar139 + 0.16666666) * fVar139 + fVar55) * auVar49._8_4_) +
                   fVar92;
              auVar107._12_4_ =
                   (float)((int)fVar140 * 0x800000 + (int)fVar94) *
                   (fVar141 + fVar94 +
                   (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                     0.041665796) * fVar141 + 0.16666666) * fVar141 + fVar56) * auVar49._12_4_) +
                   fVar94;
              auVar73 = rcpps(auVar49,auVar107);
              fVar57 = auVar73._0_4_;
              fVar89 = auVar73._4_4_;
              fVar91 = auVar73._8_4_;
              fVar93 = auVar73._12_4_;
              auVar66._0_4_ = (fVar58 - auVar107._0_4_ * fVar57) * fVar57 + fVar57;
              auVar66._4_4_ = (fVar90 - auVar107._4_4_ * fVar89) * fVar89 + fVar89;
              auVar66._8_4_ = (fVar92 - auVar107._8_4_ * fVar91) * fVar91 + fVar91;
              auVar66._12_4_ = (fVar94 - auVar107._12_4_ * fVar93) * fVar93 + fVar93;
              break;
            case 5:
              auVar73 = minps(auVar47,_DAT_004f0400);
              auVar73 = maxps(auVar73,_DAT_004f0410);
              fVar124 = auVar73._0_4_ * 1.442695 + fVar41;
              fVar139 = auVar73._4_4_ * 1.442695 + fVar54;
              fVar140 = auVar73._8_4_ * 1.442695 + fVar55;
              fVar141 = auVar73._12_4_ * 1.442695 + fVar56;
              fVar58 = (float)(int)fVar124;
              fVar90 = (float)(int)fVar139;
              fVar92 = (float)(int)fVar140;
              fVar94 = (float)(int)fVar141;
              fVar58 = fVar58 - (float)(-(uint)(fVar124 < fVar58) & 0x3f800000);
              fVar90 = fVar90 - (float)(-(uint)(fVar139 < fVar90) & 0x3f800000);
              fVar92 = fVar92 - (float)(-(uint)(fVar140 < fVar92) & 0x3f800000);
              fVar94 = fVar94 - (float)(-(uint)(fVar141 < fVar94) & 0x3f800000);
              fVar124 = auVar73._0_4_ - fVar58 * 0.6931472;
              fVar139 = auVar73._4_4_ - fVar90 * 0.6931472;
              fVar140 = auVar73._8_4_ - fVar92 * 0.6931472;
              fVar141 = auVar73._12_4_ - fVar94 * 0.6931472;
              auVar102._0_4_ =
                   (float)((int)fVar58 * 0x800000 + 0x3f800000) *
                   (fVar124 + 1.0 +
                   (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + (float)DAT_004f0480) *
                      fVar124 + 0.041665796) * fVar124 + 0.16666666) * fVar124 + fVar41) *
                   fVar124 * fVar124) + 1.0;
              auVar102._4_4_ =
                   (float)((int)fVar90 * 0x800000 + 0x3f800000) *
                   (fVar139 + 1.0 +
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + DAT_004f0480._4_4_) *
                      fVar139 + 0.041665796) * fVar139 + 0.16666666) * fVar139 + fVar54) *
                   fVar139 * fVar139) + 1.0;
              auVar102._8_4_ =
                   (float)((int)fVar92 * 0x800000 + 0x3f800000) *
                   (fVar140 + 1.0 +
                   (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + DAT_004f0480._8_4_) *
                      fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + fVar55) *
                   fVar140 * fVar140) + 1.0;
              auVar102._12_4_ =
                   (float)((int)fVar94 * 0x800000 + 0x3f800000) *
                   (fVar141 + 1.0 +
                   (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + DAT_004f0480._12_4_) *
                      fVar141 + 0.041665796) * fVar141 + 0.16666666) * fVar141 + fVar56) *
                   fVar141 * fVar141) + 1.0;
              auVar73 = maxps(auVar102,_DAT_004f04b0);
              auVar103._0_8_ = auVar73._0_8_ & 0x807fffff807fffff;
              auVar103._8_4_ = auVar73._8_4_ & 0x807fffff;
              auVar103._12_4_ = auVar73._12_4_ & 0x807fffff;
              auVar103 = auVar103 | _DAT_004f0430;
              fVar124 = auVar103._0_4_;
              fVar140 = auVar103._4_4_;
              fVar58 = auVar103._8_4_;
              fVar92 = auVar103._12_4_;
              fVar139 = fVar124 + (float)DAT_004f04f0 +
                        (float)(-(uint)(fVar124 < 0.70710677) & (uint)fVar124);
              fVar141 = fVar140 + DAT_004f04f0._4_4_ +
                        (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
              fVar90 = fVar58 + DAT_004f04f0._8_4_ +
                       (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar58);
              fVar94 = fVar92 + DAT_004f04f0._12_4_ +
                       (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
              auVar104._0_4_ =
                   ~-(uint)(auVar102._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar124 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar139 +
                          (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) *
                                 fVar139 + -0.12420141) * fVar139 + 0.14249323) * fVar139 +
                              -0.16668057) * fVar139 + 0.20000714) * fVar139 + -0.24999994) *
                            fVar139 + 0.3333333) * fVar139 + -0.5) * fVar139 * fVar139) * -2.0);
              auVar104._4_4_ =
                   ~-(uint)(auVar102._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar140 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar141 +
                          (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) *
                                 fVar141 + -0.12420141) * fVar141 + 0.14249323) * fVar141 +
                              -0.16668057) * fVar141 + 0.20000714) * fVar141 + -0.24999994) *
                            fVar141 + 0.3333333) * fVar141 + -0.5) * fVar141 * fVar141) * -2.0);
              auVar104._8_4_ =
                   ~-(uint)(auVar102._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar58 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar90
                          + (((((((((fVar90 * 0.070376836 + -0.1151461) * fVar90 + 0.116769984) *
                                   fVar90 + -0.12420141) * fVar90 + 0.14249323) * fVar90 +
                                -0.16668057) * fVar90 + 0.20000714) * fVar90 + -0.24999994) * fVar90
                             + 0.3333333) * fVar90 + -0.5) * fVar90 * fVar90) * -2.0);
              auVar104._12_4_ =
                   ~-(uint)(auVar102._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar92 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar94
                          + (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 + 0.116769984) *
                                   fVar94 + -0.12420141) * fVar94 + 0.14249323) * fVar94 +
                                -0.16668057) * fVar94 + 0.20000714) * fVar94 + -0.24999994) * fVar94
                             + 0.3333333) * fVar94 + -0.5) * fVar94 * fVar94) * -2.0);
              auVar68._0_8_ =
                   CONCAT44(-(uint)(auVar102._4_4_ <= 0.0),-(uint)(auVar102._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar68._8_4_ = -(uint)(auVar102._8_4_ <= 0.0) & 0x7fffffff;
              auVar68._12_4_ = -(uint)(auVar102._12_4_ <= 0.0) & 0x7fffffff;
              auVar73 = minps(auVar68 | auVar104,_DAT_004f0400);
              auVar73 = maxps(auVar73,_DAT_004f0410);
              fVar124 = auVar73._0_4_ * 1.442695 + fVar41;
              fVar139 = auVar73._4_4_ * 1.442695 + fVar54;
              fVar140 = auVar73._8_4_ * 1.442695 + fVar55;
              fVar141 = auVar73._12_4_ * 1.442695 + fVar56;
              fVar58 = (float)(int)fVar124;
              fVar90 = (float)(int)fVar139;
              fVar92 = (float)(int)fVar140;
              fVar94 = (float)(int)fVar141;
              fVar58 = fVar58 - (float)(-(uint)(fVar124 < fVar58) & 0x3f800000);
              fVar90 = fVar90 - (float)(-(uint)(fVar139 < fVar90) & 0x3f800000);
              fVar92 = fVar92 - (float)(-(uint)(fVar140 < fVar92) & 0x3f800000);
              fVar94 = fVar94 - (float)(-(uint)(fVar141 < fVar94) & 0x3f800000);
              fVar124 = auVar73._0_4_ - fVar58 * 0.6931472;
              fVar139 = auVar73._4_4_ - fVar90 * 0.6931472;
              fVar140 = auVar73._8_4_ - fVar92 * 0.6931472;
              fVar141 = auVar73._12_4_ - fVar94 * 0.6931472;
              auVar105._0_4_ = fVar124 * fVar124;
              auVar105._4_4_ = fVar139 * fVar139;
              auVar105._8_4_ = fVar140 * fVar140;
              auVar105._12_4_ = fVar141 * fVar141;
              auVar133._0_4_ =
                   (float)((int)fVar58 * 0x800000 + 0x3f800000) *
                   (fVar124 + 1.0 +
                   (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + (float)DAT_004f0480) *
                      fVar124 + 0.041665796) * fVar124 + 0.16666666) * fVar124 + fVar41) *
                   auVar105._0_4_) + 1.0;
              auVar133._4_4_ =
                   (float)((int)fVar90 * 0x800000 + 0x3f800000) *
                   (fVar139 + 1.0 +
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + DAT_004f0480._4_4_) *
                      fVar139 + 0.041665796) * fVar139 + 0.16666666) * fVar139 + fVar54) *
                   auVar105._4_4_) + 1.0;
              auVar133._8_4_ =
                   (float)((int)fVar92 * 0x800000 + 0x3f800000) *
                   (fVar140 + 1.0 +
                   (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + DAT_004f0480._8_4_) *
                      fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + fVar55) *
                   auVar105._8_4_) + 1.0;
              auVar133._12_4_ =
                   (float)((int)fVar94 * 0x800000 + 0x3f800000) *
                   (fVar141 + 1.0 +
                   (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + DAT_004f0480._12_4_) *
                      fVar141 + 0.041665796) * fVar141 + 0.16666666) * fVar141 + fVar56) *
                   auVar105._12_4_) + 1.0;
              auVar73 = rcpps(auVar105,auVar133);
              fVar41 = auVar73._0_4_;
              fVar54 = auVar73._4_4_;
              fVar55 = auVar73._8_4_;
              fVar56 = auVar73._12_4_;
              auVar71._0_4_ =
                   fVar41 + fVar41 + (float)DAT_004f04f0 +
                   (2.0 - auVar133._0_4_ * (fVar41 + fVar41)) * fVar41;
              auVar71._4_4_ =
                   fVar54 + fVar54 + DAT_004f04f0._4_4_ +
                   (2.0 - auVar133._4_4_ * (fVar54 + fVar54)) * fVar54;
              auVar71._8_4_ =
                   fVar55 + fVar55 + DAT_004f04f0._8_4_ +
                   (2.0 - auVar133._8_4_ * (fVar55 + fVar55)) * fVar55;
              auVar71._12_4_ =
                   fVar56 + fVar56 + DAT_004f04f0._12_4_ +
                   (2.0 - auVar133._12_4_ * (fVar56 + fVar56)) * fVar56;
              goto LAB_0027620b;
            case 6:
              fVar41 = **(float **)(&this->field_0xe8 + (long)p_Var7);
              fVar54 = (*(float **)(&this->field_0xe8 + (long)p_Var7))[1];
              auVar70._0_4_ = fVar41 * fVar57 + fVar54;
              auVar70._4_4_ = fVar41 * fVar89 + fVar54;
              auVar70._8_4_ = fVar41 * fVar91 + fVar54;
              auVar70._12_4_ = fVar41 * fVar93 + fVar54;
              auVar73 = maxps(auVar70,ZEXT816(0));
              auVar71 = minps(auVar73,_DAT_004f0440);
LAB_0027620b:
              auVar66._0_4_ = auVar71._0_4_ * fVar57;
              auVar66._4_4_ = auVar71._4_4_ * fVar89;
              auVar66._8_4_ = auVar71._8_4_ * fVar91;
              auVar66._12_4_ = auVar71._12_4_ * fVar93;
            }
switchD_00275e9d_caseD_1:
            *pauVar19 = auVar66;
            pauVar19 = pauVar19 + 1;
          }
        }
        if ((iVar30 == 4 & (bVar27 ^ 1)) != 0) {
          pauVar19 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar21 * top_blob->elemsize + (long)top_blob->data);
          for (uVar25 = 0; uVar25 != uVar6; uVar25 = uVar25 + 1) {
            fVar57 = 0.0;
            fVar89 = 0.0;
            fVar91 = 0.0;
            fVar93 = 0.0;
            auVar108 = ZEXT816(0);
            if (lVar8 != 0) {
              uVar3 = *(undefined4 *)(lVar8 + uVar25 * 4);
              auVar108._4_4_ = (float)uVar3;
              auVar108._0_4_ = (float)uVar3;
              auVar108._8_4_ = (float)uVar3;
              auVar108._12_4_ = (float)uVar3;
            }
            pfVar28 = (float *)(uVar25 * (long)iVar5 * 4 + (long)(this->weight_data_tm).data);
            pauVar33 = (undefined1 (*) [16])
                       ((long)bottom_blob->w * uVar21 * bottom_blob->elemsize +
                       (long)bottom_blob->data);
            fVar124 = 0.0;
            fVar139 = 0.0;
            fVar140 = 0.0;
            fVar141 = 0.0;
            fVar41 = 0.0;
            fVar54 = 0.0;
            fVar55 = 0.0;
            fVar56 = 0.0;
            for (iVar34 = 0; iVar34 + 3 < iVar5; iVar34 = iVar34 + 4) {
              auVar73 = *pauVar33;
              auVar125 = pauVar33[1];
              auVar84 = pauVar33[2];
              auVar97 = pauVar33[3];
              fVar58 = *pfVar28;
              fVar90 = pfVar28[1];
              fVar92 = pfVar28[2];
              fVar94 = pfVar28[3];
              auVar109._0_4_ = auVar108._0_4_ + fVar58 * auVar73._0_4_;
              auVar109._4_4_ = auVar108._4_4_ + fVar58 * auVar73._4_4_;
              auVar109._8_4_ = auVar108._8_4_ + fVar58 * auVar73._8_4_;
              auVar109._12_4_ = auVar108._12_4_ + fVar58 * auVar73._12_4_;
              fVar41 = fVar41 + fVar90 * auVar125._0_4_;
              fVar54 = fVar54 + fVar90 * auVar125._4_4_;
              fVar55 = fVar55 + fVar90 * auVar125._8_4_;
              fVar56 = fVar56 + fVar90 * auVar125._12_4_;
              fVar124 = fVar124 + fVar92 * auVar84._0_4_;
              fVar139 = fVar139 + fVar92 * auVar84._4_4_;
              fVar140 = fVar140 + fVar92 * auVar84._8_4_;
              fVar141 = fVar141 + fVar92 * auVar84._12_4_;
              fVar57 = fVar57 + fVar94 * auVar97._0_4_;
              fVar89 = fVar89 + fVar94 * auVar97._4_4_;
              fVar91 = fVar91 + fVar94 * auVar97._8_4_;
              fVar93 = fVar93 + fVar94 * auVar97._12_4_;
              pauVar33 = pauVar33 + 4;
              pfVar28 = pfVar28 + 4;
              auVar108 = auVar109;
            }
            lVar32 = 0;
            while( true ) {
              fVar92 = auVar108._12_4_;
              fVar58 = auVar108._4_4_;
              fVar90 = auVar108._8_4_;
              if (iVar5 <= iVar34) break;
              auVar73 = *(undefined1 (*) [16])(*pauVar33 + lVar32 * 4);
              fVar94 = *(float *)((long)pfVar28 + lVar32);
              auVar108._0_4_ = auVar108._0_4_ + fVar94 * auVar73._0_4_;
              auVar108._4_4_ = fVar58 + fVar94 * auVar73._4_4_;
              auVar108._8_4_ = fVar90 + fVar94 * auVar73._8_4_;
              auVar108._12_4_ = fVar92 + fVar94 * auVar73._12_4_;
              iVar34 = iVar34 + 1;
              lVar32 = lVar32 + 4;
            }
            fVar57 = fVar41 + auVar108._0_4_ + fVar124 + fVar57;
            fVar89 = fVar54 + fVar58 + fVar139 + fVar89;
            auVar50._0_8_ = CONCAT44(fVar89,fVar57);
            auVar50._8_4_ = fVar55 + fVar90 + fVar140 + fVar91;
            auVar50._12_4_ = fVar56 + fVar92 + fVar141 + fVar93;
            if (5 < iVar17 - 1U) {
              auVar51._8_4_ = auVar50._8_4_;
              auVar51._0_8_ = auVar50._0_8_;
              auVar51._12_4_ = auVar50._12_4_;
              goto switchD_00276348_caseD_1;
            }
            auVar72._8_4_ = auVar50._8_4_;
            auVar72._0_8_ = auVar50._0_8_;
            auVar72._12_4_ = auVar50._12_4_;
            auVar73 = maxps(auVar72,ZEXT816(0));
            fVar91 = (float)DAT_004f0430;
            fVar93 = DAT_004f0430._4_4_;
            fVar41 = DAT_004f0430._8_4_;
            fVar54 = DAT_004f0430._12_4_;
            auVar51 = auVar73;
            switch(iVar17) {
            case 2:
              auVar125 = minps(auVar50,ZEXT816(0));
              fVar57 = **(float **)(&this->field_0xe8 + (long)p_Var7);
              auVar51._0_4_ = auVar73._0_4_ + fVar57 * auVar125._0_4_;
              auVar51._4_4_ = auVar73._4_4_ + fVar57 * auVar125._4_4_;
              auVar51._8_4_ = auVar73._8_4_ + fVar57 * auVar125._8_4_;
              auVar51._12_4_ = auVar73._12_4_ + fVar57 * auVar125._12_4_;
              break;
            case 3:
              uVar3 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var7);
              uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var7))[1];
              auVar76._4_4_ = uVar3;
              auVar76._0_4_ = uVar3;
              auVar76._8_4_ = uVar3;
              auVar76._12_4_ = uVar3;
              auVar114._4_4_ = uVar2;
              auVar114._0_4_ = uVar2;
              auVar114._8_4_ = uVar2;
              auVar114._12_4_ = uVar2;
              auVar73 = maxps(auVar50,auVar76);
              auVar51 = minps(auVar73,auVar114);
              break;
            case 4:
              auVar52._0_8_ = CONCAT44(fVar89,fVar57) ^ 0x8000000080000000;
              auVar52._8_4_ = -auVar50._8_4_;
              auVar52._12_4_ = -auVar50._12_4_;
              auVar73 = minps(auVar52,_DAT_004f0400);
              auVar73 = maxps(auVar73,_DAT_004f0410);
              fVar89 = auVar73._0_4_ * 1.442695 + fVar91;
              fVar56 = auVar73._4_4_ * 1.442695 + fVar93;
              fVar139 = auVar73._8_4_ * 1.442695 + fVar41;
              fVar141 = auVar73._12_4_ * 1.442695 + fVar54;
              fVar57 = (float)(int)fVar89;
              fVar55 = (float)(int)fVar56;
              fVar124 = (float)(int)fVar139;
              fVar140 = (float)(int)fVar141;
              fVar58 = (float)DAT_004f0440;
              fVar90 = DAT_004f0440._4_4_;
              fVar92 = DAT_004f0440._8_4_;
              fVar94 = DAT_004f0440._12_4_;
              fVar57 = fVar57 - (float)(-(uint)(fVar89 < fVar57) & (uint)fVar58);
              fVar55 = fVar55 - (float)(-(uint)(fVar56 < fVar55) & (uint)fVar90);
              fVar124 = fVar124 - (float)(-(uint)(fVar139 < fVar124) & (uint)fVar92);
              fVar140 = fVar140 - (float)(-(uint)(fVar141 < fVar140) & (uint)fVar94);
              fVar89 = fVar57 * -0.6931472 + auVar73._0_4_;
              fVar56 = fVar55 * -0.6931472 + auVar73._4_4_;
              fVar139 = fVar124 * -0.6931472 + auVar73._8_4_;
              fVar141 = fVar140 * -0.6931472 + auVar73._12_4_;
              auVar53._0_4_ = fVar89 * fVar89;
              auVar53._4_4_ = fVar56 * fVar56;
              auVar53._8_4_ = fVar139 * fVar139;
              auVar53._12_4_ = fVar141 * fVar141;
              auVar115._0_4_ =
                   (float)((int)fVar57 * 0x800000 + (int)fVar58) *
                   (fVar89 + fVar58 +
                   (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                     0.041665796) * fVar89 + 0.16666666) * fVar89 + fVar91) * auVar53._0_4_) +
                   fVar58;
              auVar115._4_4_ =
                   (float)((int)fVar55 * 0x800000 + (int)fVar90) *
                   (fVar56 + fVar90 +
                   (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                     0.041665796) * fVar56 + 0.16666666) * fVar56 + fVar93) * auVar53._4_4_) +
                   fVar90;
              auVar115._8_4_ =
                   (float)((int)fVar124 * 0x800000 + (int)fVar92) *
                   (fVar139 + fVar92 +
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                     0.041665796) * fVar139 + 0.16666666) * fVar139 + fVar41) * auVar53._8_4_) +
                   fVar92;
              auVar115._12_4_ =
                   (float)((int)fVar140 * 0x800000 + (int)fVar94) *
                   (fVar141 + fVar94 +
                   (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                     0.041665796) * fVar141 + 0.16666666) * fVar141 + fVar54) * auVar53._12_4_) +
                   fVar94;
              auVar73 = rcpps(auVar53,auVar115);
              fVar57 = auVar73._0_4_;
              fVar89 = auVar73._4_4_;
              fVar91 = auVar73._8_4_;
              fVar93 = auVar73._12_4_;
              auVar51._0_4_ = (fVar58 - auVar115._0_4_ * fVar57) * fVar57 + fVar57;
              auVar51._4_4_ = (fVar90 - auVar115._4_4_ * fVar89) * fVar89 + fVar89;
              auVar51._8_4_ = (fVar92 - auVar115._8_4_ * fVar91) * fVar91 + fVar91;
              auVar51._12_4_ = (fVar94 - auVar115._12_4_ * fVar93) * fVar93 + fVar93;
              break;
            case 5:
              auVar74._8_4_ = auVar50._8_4_;
              auVar74._0_8_ = auVar50._0_8_;
              auVar74._12_4_ = auVar50._12_4_;
              auVar73 = minps(auVar74,_DAT_004f0400);
              auVar73 = maxps(auVar73,_DAT_004f0410);
              fVar55 = auVar73._0_4_ * 1.442695 + fVar91;
              fVar56 = auVar73._4_4_ * 1.442695 + fVar93;
              fVar124 = auVar73._8_4_ * 1.442695 + fVar41;
              fVar139 = auVar73._12_4_ * 1.442695 + fVar54;
              fVar140 = (float)(int)fVar55;
              fVar141 = (float)(int)fVar56;
              fVar58 = (float)(int)fVar124;
              fVar90 = (float)(int)fVar139;
              fVar140 = fVar140 - (float)(-(uint)(fVar55 < fVar140) & 0x3f800000);
              fVar141 = fVar141 - (float)(-(uint)(fVar56 < fVar141) & 0x3f800000);
              fVar58 = fVar58 - (float)(-(uint)(fVar124 < fVar58) & 0x3f800000);
              fVar90 = fVar90 - (float)(-(uint)(fVar139 < fVar90) & 0x3f800000);
              fVar55 = auVar73._0_4_ - fVar140 * 0.6931472;
              fVar56 = auVar73._4_4_ - fVar141 * 0.6931472;
              fVar124 = auVar73._8_4_ - fVar58 * 0.6931472;
              fVar139 = auVar73._12_4_ - fVar90 * 0.6931472;
              auVar110._0_4_ =
                   (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                   (fVar55 + 1.0 +
                   (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + (float)DAT_004f0480) *
                      fVar55 + 0.041665796) * fVar55 + 0.16666666) * fVar55 + fVar91) *
                   fVar55 * fVar55) + 1.0;
              auVar110._4_4_ =
                   (float)((int)fVar141 * 0x800000 + 0x3f800000) *
                   (fVar56 + 1.0 +
                   (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + DAT_004f0480._4_4_) *
                      fVar56 + 0.041665796) * fVar56 + 0.16666666) * fVar56 + fVar93) *
                   fVar56 * fVar56) + 1.0;
              auVar110._8_4_ =
                   (float)((int)fVar58 * 0x800000 + 0x3f800000) *
                   (fVar124 + 1.0 +
                   (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + DAT_004f0480._8_4_) *
                      fVar124 + 0.041665796) * fVar124 + 0.16666666) * fVar124 + fVar41) *
                   fVar124 * fVar124) + 1.0;
              auVar110._12_4_ =
                   (float)((int)fVar90 * 0x800000 + 0x3f800000) *
                   (fVar139 + 1.0 +
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + DAT_004f0480._12_4_) *
                      fVar139 + 0.041665796) * fVar139 + 0.16666666) * fVar139 + fVar54) *
                   fVar139 * fVar139) + 1.0;
              auVar73 = maxps(auVar110,_DAT_004f04b0);
              auVar111._0_8_ = auVar73._0_8_ & 0x807fffff807fffff;
              auVar111._8_4_ = auVar73._8_4_ & 0x807fffff;
              auVar111._12_4_ = auVar73._12_4_ & 0x807fffff;
              auVar111 = auVar111 | _DAT_004f0430;
              fVar55 = auVar111._0_4_;
              fVar124 = auVar111._4_4_;
              fVar140 = auVar111._8_4_;
              fVar58 = auVar111._12_4_;
              fVar56 = fVar55 + (float)DAT_004f04f0 +
                       (float)(-(uint)(fVar55 < 0.70710677) & (uint)fVar55);
              fVar139 = fVar124 + DAT_004f04f0._4_4_ +
                        (float)(-(uint)(fVar124 < 0.70710677) & (uint)fVar124);
              fVar141 = fVar140 + DAT_004f04f0._8_4_ +
                        (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
              fVar90 = fVar58 + DAT_004f04f0._12_4_ +
                       (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar58);
              auVar112._0_4_ =
                   ~-(uint)(auVar110._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar55 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar56
                          + (((((((((fVar56 * 0.070376836 + -0.1151461) * fVar56 + 0.116769984) *
                                   fVar56 + -0.12420141) * fVar56 + 0.14249323) * fVar56 +
                                -0.16668057) * fVar56 + 0.20000714) * fVar56 + -0.24999994) * fVar56
                             + 0.3333333) * fVar56 + -0.5) * fVar56 * fVar56) * -2.0);
              auVar112._4_4_ =
                   ~-(uint)(auVar110._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar124 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar139 +
                          (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) *
                                 fVar139 + -0.12420141) * fVar139 + 0.14249323) * fVar139 +
                              -0.16668057) * fVar139 + 0.20000714) * fVar139 + -0.24999994) *
                            fVar139 + 0.3333333) * fVar139 + -0.5) * fVar139 * fVar139) * -2.0);
              auVar112._8_4_ =
                   ~-(uint)(auVar110._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar140 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar141 +
                          (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) *
                                 fVar141 + -0.12420141) * fVar141 + 0.14249323) * fVar141 +
                              -0.16668057) * fVar141 + 0.20000714) * fVar141 + -0.24999994) *
                            fVar141 + 0.3333333) * fVar141 + -0.5) * fVar141 * fVar141) * -2.0);
              auVar112._12_4_ =
                   ~-(uint)(auVar110._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar73._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar58 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar90
                          + (((((((((fVar90 * 0.070376836 + -0.1151461) * fVar90 + 0.116769984) *
                                   fVar90 + -0.12420141) * fVar90 + 0.14249323) * fVar90 +
                                -0.16668057) * fVar90 + 0.20000714) * fVar90 + -0.24999994) * fVar90
                             + 0.3333333) * fVar90 + -0.5) * fVar90 * fVar90) * -2.0);
              auVar75._0_8_ =
                   CONCAT44(-(uint)(auVar110._4_4_ <= 0.0),-(uint)(auVar110._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar75._8_4_ = -(uint)(auVar110._8_4_ <= 0.0) & 0x7fffffff;
              auVar75._12_4_ = -(uint)(auVar110._12_4_ <= 0.0) & 0x7fffffff;
              auVar73 = minps(auVar75 | auVar112,_DAT_004f0400);
              auVar73 = maxps(auVar73,_DAT_004f0410);
              fVar55 = auVar73._0_4_ * 1.442695 + fVar91;
              fVar56 = auVar73._4_4_ * 1.442695 + fVar93;
              fVar124 = auVar73._8_4_ * 1.442695 + fVar41;
              fVar139 = auVar73._12_4_ * 1.442695 + fVar54;
              fVar140 = (float)(int)fVar55;
              fVar141 = (float)(int)fVar56;
              fVar58 = (float)(int)fVar124;
              fVar90 = (float)(int)fVar139;
              fVar140 = fVar140 - (float)(-(uint)(fVar55 < fVar140) & 0x3f800000);
              fVar141 = fVar141 - (float)(-(uint)(fVar56 < fVar141) & 0x3f800000);
              fVar58 = fVar58 - (float)(-(uint)(fVar124 < fVar58) & 0x3f800000);
              fVar90 = fVar90 - (float)(-(uint)(fVar139 < fVar90) & 0x3f800000);
              fVar55 = auVar73._0_4_ - fVar140 * 0.6931472;
              fVar56 = auVar73._4_4_ - fVar141 * 0.6931472;
              fVar124 = auVar73._8_4_ - fVar58 * 0.6931472;
              fVar139 = auVar73._12_4_ - fVar90 * 0.6931472;
              auVar113._0_4_ = fVar55 * fVar55;
              auVar113._4_4_ = fVar56 * fVar56;
              auVar113._8_4_ = fVar124 * fVar124;
              auVar113._12_4_ = fVar139 * fVar139;
              auVar134._0_4_ =
                   (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                   (fVar55 + 1.0 +
                   (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + (float)DAT_004f0480) *
                      fVar55 + 0.041665796) * fVar55 + 0.16666666) * fVar55 + fVar91) *
                   auVar113._0_4_) + 1.0;
              auVar134._4_4_ =
                   (float)((int)fVar141 * 0x800000 + 0x3f800000) *
                   (fVar56 + 1.0 +
                   (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + DAT_004f0480._4_4_) *
                      fVar56 + 0.041665796) * fVar56 + 0.16666666) * fVar56 + fVar93) *
                   auVar113._4_4_) + 1.0;
              auVar134._8_4_ =
                   (float)((int)fVar58 * 0x800000 + 0x3f800000) *
                   (fVar124 + 1.0 +
                   (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + DAT_004f0480._8_4_) *
                      fVar124 + 0.041665796) * fVar124 + 0.16666666) * fVar124 + fVar41) *
                   auVar113._8_4_) + 1.0;
              auVar134._12_4_ =
                   (float)((int)fVar90 * 0x800000 + 0x3f800000) *
                   (fVar139 + 1.0 +
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + DAT_004f0480._12_4_) *
                      fVar139 + 0.041665796) * fVar139 + 0.16666666) * fVar139 + fVar54) *
                   auVar113._12_4_) + 1.0;
              auVar73 = rcpps(auVar113,auVar134);
              fVar91 = auVar73._0_4_;
              fVar93 = auVar73._4_4_;
              fVar41 = auVar73._8_4_;
              fVar54 = auVar73._12_4_;
              auVar78._0_4_ =
                   fVar91 + fVar91 + (float)DAT_004f04f0 +
                   (2.0 - auVar134._0_4_ * (fVar91 + fVar91)) * fVar91;
              auVar78._4_4_ =
                   fVar93 + fVar93 + DAT_004f04f0._4_4_ +
                   (2.0 - auVar134._4_4_ * (fVar93 + fVar93)) * fVar93;
              auVar78._8_4_ =
                   fVar41 + fVar41 + DAT_004f04f0._8_4_ +
                   (2.0 - auVar134._8_4_ * (fVar41 + fVar41)) * fVar41;
              auVar78._12_4_ =
                   fVar54 + fVar54 + DAT_004f04f0._12_4_ +
                   (2.0 - auVar134._12_4_ * (fVar54 + fVar54)) * fVar54;
              goto LAB_002766b6;
            case 6:
              fVar91 = **(float **)(&this->field_0xe8 + (long)p_Var7);
              fVar93 = (*(float **)(&this->field_0xe8 + (long)p_Var7))[1];
              auVar77._0_4_ = fVar91 * fVar57 + fVar93;
              auVar77._4_4_ = fVar91 * fVar89 + fVar93;
              auVar77._8_4_ = fVar91 * auVar50._8_4_ + fVar93;
              auVar77._12_4_ = fVar91 * auVar50._12_4_ + fVar93;
              auVar73 = maxps(auVar77,ZEXT816(0));
              auVar78 = minps(auVar73,_DAT_004f0440);
LAB_002766b6:
              auVar51._0_4_ = auVar78._0_4_ * fVar57;
              auVar51._4_4_ = auVar78._4_4_ * fVar89;
              auVar51._8_4_ = auVar78._8_4_ * auVar50._8_4_;
              auVar51._12_4_ = auVar78._12_4_ * auVar50._12_4_;
            }
switchD_00276348_caseD_1:
            *pauVar19 = auVar51;
            pauVar19 = pauVar19 + 1;
          }
        }
        if (((bVar27 ^ 1) & iVar30 == 1) != 0) {
          pfVar39 = (float *)((long)top_blob->w * uVar21 * top_blob->elemsize + (long)top_blob->data
                             );
          pvVar9 = (this->weight_data_tm).data;
          iVar34 = bottom_blob->w;
          sVar10 = bottom_blob->elemsize;
          pvVar11 = bottom_blob->data;
          pfVar28 = *(float **)(&this->field_0xe8 + (long)p_Var7);
          for (uVar25 = 0; uVar25 != uVar6; uVar25 = uVar25 + 1) {
            if (lVar8 == 0) {
              fVar57 = 0.0;
            }
            else {
              fVar57 = *(float *)(lVar8 + uVar25 * 4);
            }
            pfVar20 = (float *)((long)pvVar9 + uVar25 * (long)iVar5 * 4);
            iVar24 = 0;
            auVar79 = ZEXT816(0);
            pfVar23 = (float *)((long)iVar34 * uVar21 * sVar10 + (long)pvVar11);
            while( true ) {
              fVar93 = auVar79._12_4_;
              fVar89 = auVar79._4_4_;
              fVar91 = auVar79._8_4_;
              if (iVar5 <= iVar24 + 3) break;
              auVar79._0_4_ = auVar79._0_4_ + *pfVar20 * *pfVar23;
              auVar79._4_4_ = fVar89 + pfVar20[1] * pfVar23[1];
              auVar79._8_4_ = fVar91 + pfVar20[2] * pfVar23[2];
              auVar79._12_4_ = fVar93 + pfVar20[3] * pfVar23[3];
              pfVar23 = pfVar23 + 4;
              pfVar20 = pfVar20 + 4;
              iVar24 = iVar24 + 4;
            }
            lVar32 = 0;
            for (; iVar24 < iVar5; iVar24 = iVar24 + 1) {
              fVar57 = fVar57 + pfVar20[lVar32] * pfVar23[lVar32];
              lVar32 = lVar32 + 1;
            }
            fVar57 = fVar93 + fVar89 + fVar91 + auVar79._0_4_ + fVar57;
            fVar89 = fVar57;
            switch(iVar17) {
            case 1:
              if (fVar57 <= 0.0) {
                fVar89 = 0.0;
              }
              break;
            case 2:
              fVar89 = (float)(~-(uint)(0.0 < fVar57) & (uint)*pfVar28 |
                              -(uint)(0.0 < fVar57) & 0x3f800000) * fVar57;
              break;
            case 3:
              if (fVar57 <= *pfVar28) {
                fVar57 = *pfVar28;
              }
              fVar89 = pfVar28[1];
              if (fVar57 <= pfVar28[1]) {
                fVar89 = fVar57;
              }
              break;
            case 4:
              if (88.37626 <= fVar57) {
                fVar57 = 88.37626;
              }
              fVar57 = expf((float)(-(uint)(fVar57 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar57 < -88.37626) & (uint)-fVar57));
              fVar89 = 1.0 / (fVar57 + 1.0);
              break;
            case 5:
              fVar89 = expf(fVar57);
              fVar89 = logf(fVar89 + 1.0);
              fVar89 = tanhf(fVar89);
              fVar89 = fVar89 * fVar57;
              break;
            case 6:
              fVar91 = *pfVar28;
              fVar93 = -pfVar28[1] / fVar91;
              fVar89 = 0.0;
              if ((fVar93 <= fVar57) && (fVar89 = fVar57, fVar57 <= fVar93 + 1.0 / fVar91)) {
                fVar89 = (fVar91 * fVar57 + pfVar28[1]) * fVar57;
              }
            }
            *pfVar39 = fVar89;
            pfVar39 = pfVar39 + 1;
          }
        }
        uVar21 = uVar21 + 1;
      } while( true );
    }
  }
  else {
    local_a4 = bottom_blob->w;
  }
  local_d0 = (float *)bottom_blob->data;
  local_c8 = bottom_blob->refcount;
  local_c0 = bottom_blob->elemsize;
  local_b8 = bottom_blob->elempack;
  local_b0 = bottom_blob->allocator;
  local_a0._0_4_ = bottom_blob->h;
  local_a0._4_4_ = bottom_blob->d;
  local_98 = bottom_blob->c;
  local_90 = bottom_blob->cstep;
  iVar17 = local_a8;
  if (local_c8 != (int *)0x0) {
    LOCK();
    *local_c8 = *local_c8 + 1;
    UNLOCK();
    iVar17 = bottom_blob->dims;
  }
  if (iVar17 != 1) {
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_basic = opt->use_subgroup_basic;
    opt_flatten.use_subgroup_vote = opt->use_subgroup_vote;
    opt_flatten.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_flatten.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_reserved_7 = opt->use_reserved_7;
    opt_flatten.use_reserved_8 = opt->use_reserved_8;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_d0);
  }
  bVar27 = (*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]) & 3) == 0 &
           opt->use_packing_layout;
  iVar17 = (uint)bVar27 + (uint)bVar27 * 2 + 1;
  Mat::create(top_blob,(int)*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]) /
                       iVar17,local_c0 / (ulong)(long)local_b8 << bVar27 * '\x02',iVar17,
              opt->blob_allocator);
  pfVar28 = local_d0;
  auVar73 = _DAT_004f0440;
  iVar17 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    p_Var7 = this->_vptr_InnerProduct_x86[-3];
    iVar5 = *(int *)(&this->field_0xe0 + (long)p_Var7);
    iVar30 = local_b8 * local_a4;
    uVar6 = top_blob->w;
    lVar8 = *(long *)(&this->field_0x178 + (long)p_Var7);
    fVar57 = (float)DAT_004f0440;
    fVar89 = DAT_004f0440._4_4_;
    fVar91 = DAT_004f0440._8_4_;
    fVar93 = DAT_004f0440._12_4_;
    if (top_blob->elempack == 1) {
      uVar25 = 0;
      uVar21 = (ulong)(uint)((int)uVar6 >> 2);
      if ((int)uVar6 >> 2 < 1) {
        uVar21 = uVar25;
      }
      lVar22 = (long)iVar30;
      lVar32 = lVar22 * 4;
      lVar29 = lVar22 * 0x10;
      lVar35 = lVar22 * 8;
      lVar38 = lVar22 * 0xc;
      for (uVar37 = 0; auVar125 = ZEXT816(0), uVar37 != uVar21; uVar37 = uVar37 + 1) {
        fVar124 = 0.0;
        fVar139 = 0.0;
        fVar140 = 0.0;
        fVar141 = 0.0;
        fVar41 = 0.0;
        fVar54 = 0.0;
        fVar55 = 0.0;
        fVar56 = 0.0;
        if (lVar8 != 0) {
          pfVar39 = (float *)(lVar8 + uVar37 * 0x10);
          fVar41 = *pfVar39;
          fVar54 = pfVar39[1];
          fVar55 = pfVar39[2];
          fVar56 = pfVar39[3];
        }
        pvVar9 = (this->weight_data_tm).data;
        lVar36 = 0;
        lVar26 = 0;
        fVar186 = 0.0;
        fVar190 = 0.0;
        fVar191 = 0.0;
        fVar192 = 0.0;
        fVar58 = 0.0;
        fVar90 = 0.0;
        fVar92 = 0.0;
        fVar94 = 0.0;
        fVar182 = 0.0;
        fVar183 = 0.0;
        fVar184 = 0.0;
        fVar185 = 0.0;
        for (iVar17 = 0; iVar17 + 3 < iVar30; iVar17 = iVar17 + 4) {
          pfVar39 = (float *)((long)local_d0 + lVar26);
          fVar4 = *pfVar39;
          fVar14 = pfVar39[1];
          fVar15 = pfVar39[2];
          fVar16 = pfVar39[3];
          pfVar39 = (float *)((long)pvVar9 + lVar26 + uVar25);
          pfVar20 = (float *)((long)pvVar9 + lVar26 + lVar32);
          pfVar23 = (float *)((long)pvVar9 + lVar26 + lVar35);
          pfVar1 = (float *)((long)pvVar9 + lVar26 + lVar38);
          fVar182 = fVar182 + *pfVar39 * fVar4;
          fVar183 = fVar183 + pfVar39[1] * fVar14;
          fVar184 = fVar184 + pfVar39[2] * fVar15;
          fVar185 = fVar185 + pfVar39[3] * fVar16;
          fVar124 = fVar124 + *pfVar20 * fVar4;
          fVar139 = fVar139 + pfVar20[1] * fVar14;
          fVar140 = fVar140 + pfVar20[2] * fVar15;
          fVar141 = fVar141 + pfVar20[3] * fVar16;
          fVar186 = fVar186 + *pfVar23 * fVar4;
          fVar190 = fVar190 + pfVar23[1] * fVar14;
          fVar191 = fVar191 + pfVar23[2] * fVar15;
          fVar192 = fVar192 + pfVar23[3] * fVar16;
          fVar58 = fVar58 + *pfVar1 * fVar4;
          fVar90 = fVar90 + pfVar1[1] * fVar14;
          fVar92 = fVar92 + pfVar1[2] * fVar15;
          fVar94 = fVar94 + pfVar1[3] * fVar16;
          lVar26 = lVar26 + 0x10;
          lVar36 = lVar36 + 4;
        }
        for (; (int)lVar36 < iVar30; lVar36 = lVar36 + 1) {
          fVar4 = local_d0[lVar36];
          fVar41 = fVar41 + fVar4 * *(float *)((long)pvVar9 + lVar36 * 4 + uVar25);
          fVar54 = fVar54 + fVar4 * *(float *)((long)pvVar9 + lVar36 * 4 + lVar32);
          fVar55 = fVar55 + fVar4 * *(float *)((long)pvVar9 + lVar36 * 4 + lVar35);
          fVar56 = fVar56 + fVar4 * *(float *)((long)pvVar9 + lVar36 * 4 + lVar38);
        }
        fVar41 = fVar185 + fVar184 + fVar183 + fVar182 + fVar41;
        fVar54 = fVar141 + fVar140 + fVar139 + fVar124 + fVar54;
        auVar187._0_8_ = CONCAT44(fVar54,fVar41);
        auVar187._8_4_ = fVar192 + fVar191 + fVar190 + fVar186 + fVar55;
        auVar187._12_4_ = fVar94 + fVar92 + fVar90 + fVar58 + fVar56;
        if (5 < iVar5 - 1U) {
          auVar188._8_4_ = auVar187._8_4_;
          auVar188._0_8_ = auVar187._0_8_;
          auVar188._12_4_ = auVar187._12_4_;
          goto switchD_0027716b_caseD_1;
        }
        auVar83._8_4_ = auVar187._8_4_;
        auVar83._0_8_ = auVar187._0_8_;
        auVar83._12_4_ = auVar187._12_4_;
        auVar84 = maxps(auVar83,auVar125);
        auVar188 = auVar84;
        switch(iVar5) {
        case 2:
          auVar125 = minps(auVar187,auVar125);
          fVar41 = **(float **)(&this->field_0xe8 + (long)p_Var7);
          auVar188._0_4_ = auVar84._0_4_ + fVar41 * auVar125._0_4_;
          auVar188._4_4_ = auVar84._4_4_ + fVar41 * auVar125._4_4_;
          auVar188._8_4_ = auVar84._8_4_ + fVar41 * auVar125._8_4_;
          auVar188._12_4_ = auVar84._12_4_ + fVar41 * auVar125._12_4_;
          break;
        case 3:
          uVar3 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var7);
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var7))[1];
          auVar86._4_4_ = uVar3;
          auVar86._0_4_ = uVar3;
          auVar86._8_4_ = uVar3;
          auVar86._12_4_ = uVar3;
          auVar122._4_4_ = uVar2;
          auVar122._0_4_ = uVar2;
          auVar122._8_4_ = uVar2;
          auVar122._12_4_ = uVar2;
          auVar125 = maxps(auVar187,auVar86);
          auVar188 = minps(auVar125,auVar122);
          break;
        case 4:
          auVar189._0_8_ = CONCAT44(fVar54,fVar41) ^ 0x8000000080000000;
          auVar189._8_4_ = -auVar187._8_4_;
          auVar189._12_4_ = -auVar187._12_4_;
          auVar125 = minps(auVar189,_DAT_004f0400);
          auVar125 = maxps(auVar125,_DAT_004f0410);
          fVar54 = auVar125._0_4_ * 1.442695 + 0.5;
          fVar56 = auVar125._4_4_ * 1.442695 + 0.5;
          fVar139 = auVar125._8_4_ * 1.442695 + 0.5;
          fVar141 = auVar125._12_4_ * 1.442695 + 0.5;
          fVar41 = (float)(int)fVar54;
          fVar55 = (float)(int)fVar56;
          fVar124 = (float)(int)fVar139;
          fVar140 = (float)(int)fVar141;
          fVar41 = fVar41 - (float)(-(uint)(fVar54 < fVar41) & (uint)fVar57);
          fVar55 = fVar55 - (float)(-(uint)(fVar56 < fVar55) & (uint)fVar89);
          fVar124 = fVar124 - (float)(-(uint)(fVar139 < fVar124) & (uint)fVar91);
          fVar140 = fVar140 - (float)(-(uint)(fVar141 < fVar140) & (uint)fVar93);
          fVar54 = fVar41 * -0.6931472 + auVar125._0_4_;
          fVar56 = fVar55 * -0.6931472 + auVar125._4_4_;
          fVar139 = fVar124 * -0.6931472 + auVar125._8_4_;
          fVar141 = fVar140 * -0.6931472 + auVar125._12_4_;
          auVar138._0_4_ = fVar54 * fVar54;
          auVar138._4_4_ = fVar56 * fVar56;
          auVar138._8_4_ = fVar139 * fVar139;
          auVar138._12_4_ = fVar141 * fVar141;
          auVar123._0_4_ =
               (float)((int)fVar41 * 0x800000 + (int)fVar57) *
               (fVar54 + fVar57 +
               (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                 0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5) * auVar138._0_4_) + fVar57;
          auVar123._4_4_ =
               (float)((int)fVar55 * 0x800000 + (int)fVar89) *
               (fVar56 + fVar89 +
               (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                 0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5) * auVar138._4_4_) + fVar89;
          auVar123._8_4_ =
               (float)((int)fVar124 * 0x800000 + (int)fVar91) *
               (fVar139 + fVar91 +
               (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                 0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) * auVar138._8_4_) + fVar91;
          auVar123._12_4_ =
               (float)((int)fVar140 * 0x800000 + (int)fVar93) *
               (fVar141 + fVar93 +
               (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                 0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5) * auVar138._12_4_) + fVar93;
          auVar125 = rcpps(auVar138,auVar123);
          fVar41 = auVar125._0_4_;
          fVar54 = auVar125._4_4_;
          fVar55 = auVar125._8_4_;
          fVar56 = auVar125._12_4_;
          auVar188._0_4_ = (fVar57 - auVar123._0_4_ * fVar41) * fVar41 + fVar41;
          auVar188._4_4_ = (fVar89 - auVar123._4_4_ * fVar54) * fVar54 + fVar54;
          auVar188._8_4_ = (fVar91 - auVar123._8_4_ * fVar55) * fVar55 + fVar55;
          auVar188._12_4_ = (fVar93 - auVar123._12_4_ * fVar56) * fVar56 + fVar56;
          break;
        case 5:
          auVar85._8_4_ = auVar187._8_4_;
          auVar85._0_8_ = auVar187._0_8_;
          auVar85._12_4_ = auVar187._12_4_;
          auVar125 = minps(auVar85,_DAT_004f0400);
          auVar125 = maxps(auVar125,_DAT_004f0410);
          fVar55 = auVar125._0_4_ * 1.442695 + 0.5;
          fVar56 = auVar125._4_4_ * 1.442695 + 0.5;
          fVar124 = auVar125._8_4_ * 1.442695 + 0.5;
          fVar139 = auVar125._12_4_ * 1.442695 + 0.5;
          fVar140 = (float)(int)fVar55;
          fVar141 = (float)(int)fVar56;
          fVar58 = (float)(int)fVar124;
          fVar90 = (float)(int)fVar139;
          fVar140 = fVar140 - (float)(-(uint)(fVar55 < fVar140) & (uint)fVar57);
          fVar141 = fVar141 - (float)(-(uint)(fVar56 < fVar141) & (uint)fVar89);
          fVar58 = fVar58 - (float)(-(uint)(fVar124 < fVar58) & (uint)fVar91);
          fVar90 = fVar90 - (float)(-(uint)(fVar139 < fVar90) & (uint)fVar93);
          fVar55 = auVar125._0_4_ - fVar140 * 0.6931472;
          fVar56 = auVar125._4_4_ - fVar141 * 0.6931472;
          fVar124 = auVar125._8_4_ - fVar58 * 0.6931472;
          fVar139 = auVar125._12_4_ - fVar90 * 0.6931472;
          auVar180._0_4_ =
               (float)((int)fVar140 * 0x800000 + (int)fVar57) *
               (fVar55 + fVar57 +
               (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                 0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5) * fVar55 * fVar55) + fVar57;
          auVar180._4_4_ =
               (float)((int)fVar141 * 0x800000 + (int)fVar89) *
               (fVar56 + fVar89 +
               (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                 0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5) * fVar56 * fVar56) + fVar89;
          auVar180._8_4_ =
               (float)((int)fVar58 * 0x800000 + (int)fVar91) *
               (fVar124 + fVar91 +
               (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
                 0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5) * fVar124 * fVar124) + fVar91
          ;
          auVar180._12_4_ =
               (float)((int)fVar90 * 0x800000 + (int)fVar93) *
               (fVar139 + fVar93 +
               (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                 0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) * fVar139 * fVar139) + fVar93
          ;
          auVar125 = maxps(auVar180,_DAT_004f04b0);
          fVar55 = (float)(auVar125._0_4_ & 0x807fffff | 0x3f000000);
          fVar124 = (float)(auVar125._4_4_ & 0x807fffff | 0x3f000000);
          fVar140 = (float)(auVar125._8_4_ & 0x807fffff | 0x3f000000);
          fVar58 = (float)(auVar125._12_4_ & 0x807fffff | 0x3f000000);
          fVar56 = fVar55 + (float)DAT_004f04f0 +
                   (float)(-(uint)(fVar55 < 0.70710677) & (uint)fVar55);
          fVar139 = fVar124 + DAT_004f04f0._4_4_ +
                    (float)(-(uint)(fVar124 < 0.70710677) & (uint)fVar124);
          fVar141 = fVar140 + DAT_004f04f0._8_4_ +
                    (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
          fVar90 = fVar58 + DAT_004f04f0._12_4_ +
                   (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar58);
          auVar120._0_4_ =
               ~-(uint)(auVar180._0_4_ <= 0.0) &
               (uint)((((float)(int)((auVar125._0_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar55 < 0.70710677) & (uint)fVar57)) * 0.6931472 + fVar56 +
                      (((((((((fVar56 * 0.070376836 + -0.1151461) * fVar56 + 0.116769984) * fVar56 +
                            -0.12420141) * fVar56 + 0.14249323) * fVar56 + -0.16668057) * fVar56 +
                         0.20000714) * fVar56 + -0.24999994) * fVar56 + 0.3333333) * fVar56 + -0.5)
                      * fVar56 * fVar56) * -2.0);
          auVar120._4_4_ =
               ~-(uint)(auVar180._4_4_ <= 0.0) &
               (uint)((((float)(int)((auVar125._4_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar124 < 0.70710677) & (uint)fVar89)) * 0.6931472 + fVar139
                      + (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) *
                               fVar139 + -0.12420141) * fVar139 + 0.14249323) * fVar139 +
                            -0.16668057) * fVar139 + 0.20000714) * fVar139 + -0.24999994) * fVar139
                         + 0.3333333) * fVar139 + -0.5) * fVar139 * fVar139) * -2.0);
          auVar120._8_4_ =
               ~-(uint)(auVar180._8_4_ <= 0.0) &
               (uint)((((float)(int)((auVar125._8_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar91)) * 0.6931472 + fVar141
                      + (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) *
                               fVar141 + -0.12420141) * fVar141 + 0.14249323) * fVar141 +
                            -0.16668057) * fVar141 + 0.20000714) * fVar141 + -0.24999994) * fVar141
                         + 0.3333333) * fVar141 + -0.5) * fVar141 * fVar141) * -2.0);
          auVar120._12_4_ =
               ~-(uint)(auVar180._12_4_ <= 0.0) &
               (uint)((((float)(int)((auVar125._12_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar93)) * 0.6931472 + fVar90 +
                      (((((((((fVar90 * 0.070376836 + -0.1151461) * fVar90 + 0.116769984) * fVar90 +
                            -0.12420141) * fVar90 + 0.14249323) * fVar90 + -0.16668057) * fVar90 +
                         0.20000714) * fVar90 + -0.24999994) * fVar90 + 0.3333333) * fVar90 + -0.5)
                      * fVar90 * fVar90) * -2.0);
          auVar169._0_8_ =
               CONCAT44(-(uint)(auVar180._4_4_ <= 0.0),-(uint)(auVar180._0_4_ <= 0.0)) &
               0x7fffffff7fffffff;
          auVar169._8_4_ = -(uint)(auVar180._8_4_ <= 0.0) & 0x7fffffff;
          auVar169._12_4_ = -(uint)(auVar180._12_4_ <= 0.0) & 0x7fffffff;
          auVar125 = minps(auVar169 | auVar120,_DAT_004f0400);
          auVar125 = maxps(auVar125,_DAT_004f0410);
          fVar140 = auVar125._0_4_ * 1.442695 + 0.5;
          fVar141 = auVar125._4_4_ * 1.442695 + 0.5;
          fVar58 = auVar125._8_4_ * 1.442695 + 0.5;
          fVar90 = auVar125._12_4_ * 1.442695 + 0.5;
          fVar55 = (float)(int)fVar140;
          fVar56 = (float)(int)fVar141;
          fVar124 = (float)(int)fVar58;
          fVar139 = (float)(int)fVar90;
          fVar55 = fVar55 - (float)(-(uint)(fVar140 < fVar55) & (uint)fVar57);
          fVar56 = fVar56 - (float)(-(uint)(fVar141 < fVar56) & (uint)fVar89);
          fVar124 = fVar124 - (float)(-(uint)(fVar58 < fVar124) & (uint)fVar91);
          fVar139 = fVar139 - (float)(-(uint)(fVar90 < fVar139) & (uint)fVar93);
          fVar140 = auVar125._0_4_ - fVar55 * 0.6931472;
          fVar141 = auVar125._4_4_ - fVar56 * 0.6931472;
          fVar58 = auVar125._8_4_ - fVar124 * 0.6931472;
          fVar90 = auVar125._12_4_ - fVar139 * 0.6931472;
          auVar121._0_4_ =
               (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                 0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5) * fVar140 * fVar140;
          auVar121._4_4_ =
               (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                 0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5) * fVar141 * fVar141;
          auVar121._8_4_ =
               (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                 0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) * fVar58 * fVar58;
          auVar121._12_4_ =
               (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90 +
                 0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) * fVar90 * fVar90;
          auVar181._0_4_ =
               (float)((int)fVar55 * 0x800000 + (int)fVar57) * (fVar140 + fVar57 + auVar121._0_4_) +
               fVar57;
          auVar181._4_4_ =
               (float)((int)fVar56 * 0x800000 + (int)fVar89) * (fVar141 + fVar89 + auVar121._4_4_) +
               fVar89;
          auVar181._8_4_ =
               (float)((int)fVar124 * 0x800000 + (int)fVar91) * (fVar58 + fVar91 + auVar121._8_4_) +
               fVar91;
          auVar181._12_4_ =
               (float)((int)fVar139 * 0x800000 + (int)fVar93) * (fVar90 + fVar93 + auVar121._12_4_)
               + fVar93;
          auVar125 = rcpps(auVar121,auVar181);
          fVar55 = auVar125._0_4_;
          fVar56 = auVar125._4_4_;
          fVar124 = auVar125._8_4_;
          fVar139 = auVar125._12_4_;
          auVar88._0_4_ =
               fVar55 + fVar55 + (float)DAT_004f04f0 +
               (2.0 - auVar181._0_4_ * (fVar55 + fVar55)) * fVar55;
          auVar88._4_4_ =
               fVar56 + fVar56 + DAT_004f04f0._4_4_ +
               (2.0 - auVar181._4_4_ * (fVar56 + fVar56)) * fVar56;
          auVar88._8_4_ =
               fVar124 + fVar124 + DAT_004f04f0._8_4_ +
               (2.0 - auVar181._8_4_ * (fVar124 + fVar124)) * fVar124;
          auVar88._12_4_ =
               fVar139 + fVar139 + DAT_004f04f0._12_4_ +
               (2.0 - auVar181._12_4_ * (fVar139 + fVar139)) * fVar139;
          goto LAB_002774eb;
        case 6:
          fVar55 = **(float **)(&this->field_0xe8 + (long)p_Var7);
          fVar56 = (*(float **)(&this->field_0xe8 + (long)p_Var7))[1];
          auVar87._0_4_ = fVar55 * fVar41 + fVar56;
          auVar87._4_4_ = fVar55 * fVar54 + fVar56;
          auVar87._8_4_ = fVar55 * auVar187._8_4_ + fVar56;
          auVar87._12_4_ = fVar55 * auVar187._12_4_ + fVar56;
          auVar125 = maxps(auVar87,auVar125);
          auVar88 = minps(auVar125,auVar73);
LAB_002774eb:
          auVar188._0_4_ = auVar88._0_4_ * fVar41;
          auVar188._4_4_ = auVar88._4_4_ * fVar54;
          auVar188._8_4_ = auVar88._8_4_ * auVar187._8_4_;
          auVar188._12_4_ = auVar88._12_4_ * auVar187._12_4_;
        }
switchD_0027716b_caseD_1:
        *(undefined1 (*) [16])((long)top_blob->data + uVar37 * 0x10) = auVar188;
        lVar32 = lVar32 + lVar29;
        lVar35 = lVar35 + lVar29;
        lVar38 = lVar38 + lVar29;
        uVar25 = uVar25 + lVar29;
      }
      pvVar9 = (this->weight_data_tm).data;
      pfVar39 = *(float **)(&this->field_0xe8 + (long)p_Var7);
      pvVar11 = top_blob->data;
      for (uVar21 = (long)(int)uVar6 & 0xfffffffffffffffc; (long)uVar21 < (long)(int)uVar6;
          uVar21 = uVar21 + 1) {
        if (lVar8 == 0) {
          fVar57 = 0.0;
        }
        else {
          fVar57 = *(float *)(lVar8 + uVar21 * 4);
        }
        pfVar23 = (float *)(uVar21 * lVar22 * 4 + (long)pvVar9);
        fVar89 = 0.0;
        fVar91 = 0.0;
        fVar93 = 0.0;
        fVar41 = 0.0;
        pfVar20 = pfVar28;
        for (iVar17 = 0; iVar17 + 3 < iVar30; iVar17 = iVar17 + 4) {
          fVar89 = fVar89 + *pfVar23 * *pfVar20;
          fVar91 = fVar91 + pfVar23[1] * pfVar20[1];
          fVar93 = fVar93 + pfVar23[2] * pfVar20[2];
          fVar41 = fVar41 + pfVar23[3] * pfVar20[3];
          pfVar20 = pfVar20 + 4;
          pfVar23 = pfVar23 + 4;
        }
        lVar32 = 0;
        for (; iVar17 < iVar30; iVar17 = iVar17 + 1) {
          fVar57 = fVar57 + pfVar23[lVar32] * pfVar20[lVar32];
          lVar32 = lVar32 + 1;
        }
        fVar57 = fVar41 + fVar91 + fVar93 + fVar89 + fVar57;
        fVar89 = fVar57;
        switch(iVar5) {
        case 1:
          if (fVar57 <= 0.0) {
            fVar89 = 0.0;
          }
          break;
        case 2:
          fVar89 = (float)(~-(uint)(0.0 < fVar57) & (uint)*pfVar39 |
                          -(uint)(0.0 < fVar57) & 0x3f800000) * fVar57;
          break;
        case 3:
          if (fVar57 <= *pfVar39) {
            fVar57 = *pfVar39;
          }
          fVar89 = pfVar39[1];
          if (fVar57 <= pfVar39[1]) {
            fVar89 = fVar57;
          }
          break;
        case 4:
          if (88.37626 <= fVar57) {
            fVar57 = 88.37626;
          }
          fVar57 = expf((float)(-(uint)(fVar57 < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(fVar57 < -88.37626) & (uint)-fVar57));
          fVar89 = 1.0 / (fVar57 + 1.0);
          break;
        case 5:
          fVar89 = expf(fVar57);
          fVar89 = logf(fVar89 + 1.0);
          fVar89 = tanhf(fVar89);
          fVar89 = fVar89 * fVar57;
          break;
        case 6:
          fVar91 = *pfVar39;
          fVar93 = -pfVar39[1] / fVar91;
          fVar89 = 0.0;
          if ((fVar93 <= fVar57) && (fVar89 = fVar57, fVar57 <= fVar93 + 1.0 / fVar91)) {
            fVar89 = (fVar91 * fVar57 + pfVar39[1]) * fVar57;
          }
        }
        *(float *)((long)pvVar11 + uVar21 * 4) = fVar89;
      }
      iVar17 = 0;
    }
    else {
      iVar17 = 0;
      if (top_blob->elempack == 4) {
        iVar17 = 0;
        uVar21 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar21 = 0;
        }
        for (uVar25 = 0; auVar125 = ZEXT816(0), uVar25 != uVar21; uVar25 = uVar25 + 1) {
          fVar124 = 0.0;
          fVar139 = 0.0;
          fVar140 = 0.0;
          fVar141 = 0.0;
          fVar41 = 0.0;
          fVar54 = 0.0;
          fVar55 = 0.0;
          fVar56 = 0.0;
          if (lVar8 != 0) {
            pfVar28 = (float *)(lVar8 + uVar25 * 0x10);
            fVar41 = *pfVar28;
            fVar54 = pfVar28[1];
            fVar55 = pfVar28[2];
            fVar56 = pfVar28[3];
          }
          pfVar39 = (float *)((long)(this->weight_data_tm).w * uVar25 *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          fVar182 = 0.0;
          fVar183 = 0.0;
          fVar184 = 0.0;
          fVar185 = 0.0;
          fVar58 = 0.0;
          fVar90 = 0.0;
          fVar92 = 0.0;
          fVar94 = 0.0;
          pfVar28 = local_d0;
          for (iVar31 = 0; iVar31 + 3 < iVar30; iVar31 = iVar31 + 4) {
            fVar186 = *pfVar28;
            fVar190 = pfVar28[1];
            fVar191 = pfVar28[2];
            fVar192 = pfVar28[3];
            fVar41 = fVar41 + *pfVar39 * fVar186;
            fVar54 = fVar54 + pfVar39[1] * fVar186;
            fVar55 = fVar55 + pfVar39[2] * fVar186;
            fVar56 = fVar56 + pfVar39[3] * fVar186;
            fVar58 = fVar58 + pfVar39[4] * fVar190;
            fVar90 = fVar90 + pfVar39[5] * fVar190;
            fVar92 = fVar92 + pfVar39[6] * fVar190;
            fVar94 = fVar94 + pfVar39[7] * fVar190;
            fVar182 = fVar182 + pfVar39[8] * fVar191;
            fVar183 = fVar183 + pfVar39[9] * fVar191;
            fVar184 = fVar184 + pfVar39[10] * fVar191;
            fVar185 = fVar185 + pfVar39[0xb] * fVar191;
            fVar124 = fVar124 + pfVar39[0xc] * fVar192;
            fVar139 = fVar139 + pfVar39[0xd] * fVar192;
            fVar140 = fVar140 + pfVar39[0xe] * fVar192;
            fVar141 = fVar141 + pfVar39[0xf] * fVar192;
            pfVar28 = pfVar28 + 4;
            pfVar39 = pfVar39 + 0x10;
          }
          lVar32 = 0;
          for (; iVar31 < iVar30; iVar31 = iVar31 + 1) {
            fVar186 = *(float *)((long)pfVar28 + lVar32);
            pfVar20 = pfVar39 + lVar32;
            fVar41 = fVar41 + *pfVar20 * fVar186;
            fVar54 = fVar54 + pfVar20[1] * fVar186;
            fVar55 = fVar55 + pfVar20[2] * fVar186;
            fVar56 = fVar56 + pfVar20[3] * fVar186;
            lVar32 = lVar32 + 4;
          }
          fVar41 = fVar58 + fVar41 + fVar182 + fVar124;
          fVar54 = fVar90 + fVar54 + fVar183 + fVar139;
          auVar80._0_8_ = CONCAT44(fVar54,fVar41);
          auVar80._8_4_ = fVar92 + fVar55 + fVar184 + fVar140;
          auVar80._12_4_ = fVar94 + fVar56 + fVar185 + fVar141;
          auVar175 = auVar80;
          if (5 < iVar5 - 1U) goto switchD_00276bec_caseD_1;
          auVar174._8_4_ = auVar80._8_4_;
          auVar174._0_8_ = auVar80._0_8_;
          auVar174._12_4_ = auVar80._12_4_;
          auVar175 = maxps(auVar174,auVar125);
          switch(iVar5) {
          case 2:
            auVar125 = minps(auVar80,auVar125);
            fVar41 = **(float **)(&this->field_0xe8 + (long)p_Var7);
            auVar176._0_4_ = auVar175._0_4_ + fVar41 * auVar125._0_4_;
            auVar176._4_4_ = auVar175._4_4_ + fVar41 * auVar125._4_4_;
            auVar176._8_4_ = auVar175._8_4_ + fVar41 * auVar125._8_4_;
            auVar176._12_4_ = auVar175._12_4_ + fVar41 * auVar125._12_4_;
            auVar175 = auVar176;
            break;
          case 3:
            uVar3 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var7);
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var7))[1];
            auVar119._4_4_ = uVar3;
            auVar119._0_4_ = uVar3;
            auVar119._8_4_ = uVar3;
            auVar119._12_4_ = uVar3;
            auVar136._4_4_ = uVar2;
            auVar136._0_4_ = uVar2;
            auVar136._8_4_ = uVar2;
            auVar136._12_4_ = uVar2;
            auVar125 = maxps(auVar80,auVar119);
            auVar175 = minps(auVar125,auVar136);
            break;
          case 4:
            auVar81._0_8_ = CONCAT44(fVar54,fVar41) ^ 0x8000000080000000;
            auVar81._8_4_ = -auVar80._8_4_;
            auVar81._12_4_ = -auVar80._12_4_;
            auVar125 = minps(auVar81,_DAT_004f0400);
            auVar125 = maxps(auVar125,_DAT_004f0410);
            fVar54 = auVar125._0_4_ * 1.442695 + 0.5;
            fVar56 = auVar125._4_4_ * 1.442695 + 0.5;
            fVar139 = auVar125._8_4_ * 1.442695 + 0.5;
            fVar141 = auVar125._12_4_ * 1.442695 + 0.5;
            fVar41 = (float)(int)fVar54;
            fVar55 = (float)(int)fVar56;
            fVar124 = (float)(int)fVar139;
            fVar140 = (float)(int)fVar141;
            fVar41 = fVar41 - (float)(-(uint)(fVar54 < fVar41) & (uint)fVar57);
            fVar55 = fVar55 - (float)(-(uint)(fVar56 < fVar55) & (uint)fVar89);
            fVar124 = fVar124 - (float)(-(uint)(fVar139 < fVar124) & (uint)fVar91);
            fVar140 = fVar140 - (float)(-(uint)(fVar141 < fVar140) & (uint)fVar93);
            fVar54 = fVar41 * -0.6931472 + auVar125._0_4_;
            fVar56 = fVar55 * -0.6931472 + auVar125._4_4_;
            fVar139 = fVar124 * -0.6931472 + auVar125._8_4_;
            fVar141 = fVar140 * -0.6931472 + auVar125._12_4_;
            auVar82._0_4_ = fVar54 * fVar54;
            auVar82._4_4_ = fVar56 * fVar56;
            auVar82._8_4_ = fVar139 * fVar139;
            auVar82._12_4_ = fVar141 * fVar141;
            auVar137._0_4_ =
                 (float)((int)fVar41 * 0x800000 + (int)fVar57) *
                 (fVar54 + fVar57 +
                 (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                   0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5) * auVar82._0_4_) + fVar57;
            auVar137._4_4_ =
                 (float)((int)fVar55 * 0x800000 + (int)fVar89) *
                 (fVar56 + fVar89 +
                 (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                   0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5) * auVar82._4_4_) + fVar89;
            auVar137._8_4_ =
                 (float)((int)fVar124 * 0x800000 + (int)fVar91) *
                 (fVar139 + fVar91 +
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) * auVar82._8_4_) + fVar91;
            auVar137._12_4_ =
                 (float)((int)fVar140 * 0x800000 + (int)fVar93) *
                 (fVar141 + fVar93 +
                 (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                   0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5) * auVar82._12_4_) + fVar93;
            auVar125 = rcpps(auVar82,auVar137);
            fVar41 = auVar125._0_4_;
            fVar54 = auVar125._4_4_;
            fVar55 = auVar125._8_4_;
            fVar56 = auVar125._12_4_;
            auVar175._0_4_ = (fVar57 - auVar137._0_4_ * fVar41) * fVar41 + fVar41;
            auVar175._4_4_ = (fVar89 - auVar137._4_4_ * fVar54) * fVar54 + fVar54;
            auVar175._8_4_ = (fVar91 - auVar137._8_4_ * fVar55) * fVar55 + fVar55;
            auVar175._12_4_ = (fVar93 - auVar137._12_4_ * fVar56) * fVar56 + fVar56;
            break;
          case 5:
            auVar116._8_4_ = auVar80._8_4_;
            auVar116._0_8_ = auVar80._0_8_;
            auVar116._12_4_ = auVar80._12_4_;
            auVar125 = minps(auVar116,_DAT_004f0400);
            auVar125 = maxps(auVar125,_DAT_004f0410);
            fVar55 = auVar125._0_4_ * 1.442695 + 0.5;
            fVar56 = auVar125._4_4_ * 1.442695 + 0.5;
            fVar124 = auVar125._8_4_ * 1.442695 + 0.5;
            fVar139 = auVar125._12_4_ * 1.442695 + 0.5;
            fVar140 = (float)(int)fVar55;
            fVar141 = (float)(int)fVar56;
            fVar58 = (float)(int)fVar124;
            fVar90 = (float)(int)fVar139;
            fVar140 = fVar140 - (float)(-(uint)(fVar55 < fVar140) & (uint)fVar57);
            fVar141 = fVar141 - (float)(-(uint)(fVar56 < fVar141) & (uint)fVar89);
            fVar58 = fVar58 - (float)(-(uint)(fVar124 < fVar58) & (uint)fVar91);
            fVar90 = fVar90 - (float)(-(uint)(fVar139 < fVar90) & (uint)fVar93);
            fVar55 = auVar125._0_4_ - fVar140 * 0.6931472;
            fVar56 = auVar125._4_4_ - fVar141 * 0.6931472;
            fVar124 = auVar125._8_4_ - fVar58 * 0.6931472;
            fVar139 = auVar125._12_4_ - fVar90 * 0.6931472;
            auVar177._0_4_ =
                 (float)((int)fVar140 * 0x800000 + (int)fVar57) *
                 (fVar55 + fVar57 +
                 (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                   0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5) * fVar55 * fVar55) + fVar57;
            auVar177._4_4_ =
                 (float)((int)fVar141 * 0x800000 + (int)fVar89) *
                 (fVar56 + fVar89 +
                 (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                   0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5) * fVar56 * fVar56) + fVar89;
            auVar177._8_4_ =
                 (float)((int)fVar58 * 0x800000 + (int)fVar91) *
                 (fVar124 + fVar91 +
                 (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
                   0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5) * fVar124 * fVar124) +
                 fVar91;
            auVar177._12_4_ =
                 (float)((int)fVar90 * 0x800000 + (int)fVar93) *
                 (fVar139 + fVar93 +
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) * fVar139 * fVar139) +
                 fVar93;
            auVar125 = maxps(auVar177,_DAT_004f04b0);
            fVar55 = (float)(auVar125._0_4_ & 0x807fffff | 0x3f000000);
            fVar124 = (float)(auVar125._4_4_ & 0x807fffff | 0x3f000000);
            fVar140 = (float)(auVar125._8_4_ & 0x807fffff | 0x3f000000);
            fVar58 = (float)(auVar125._12_4_ & 0x807fffff | 0x3f000000);
            fVar56 = fVar55 + -1.0 + (float)(-(uint)(fVar55 < 0.70710677) & (uint)fVar55);
            fVar139 = fVar124 + -1.0 + (float)(-(uint)(fVar124 < 0.70710677) & (uint)fVar124);
            fVar141 = fVar140 + -1.0 + (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
            fVar90 = fVar58 + -1.0 + (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar58);
            auVar135._0_4_ =
                 ~-(uint)(auVar177._0_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar125._0_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar55 < 0.70710677) & (uint)fVar57)) * 0.6931472 + fVar56
                        + (((((((((fVar56 * 0.070376836 + -0.1151461) * fVar56 + 0.116769984) *
                                 fVar56 + -0.12420141) * fVar56 + 0.14249323) * fVar56 + -0.16668057
                              ) * fVar56 + 0.20000714) * fVar56 + -0.24999994) * fVar56 + 0.3333333)
                           * fVar56 + -0.5) * fVar56 * fVar56) * -2.0);
            auVar135._4_4_ =
                 ~-(uint)(auVar177._4_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar125._4_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar124 < 0.70710677) & (uint)fVar89)) * 0.6931472 +
                         fVar139 +
                        (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) *
                               fVar139 + -0.12420141) * fVar139 + 0.14249323) * fVar139 +
                            -0.16668057) * fVar139 + 0.20000714) * fVar139 + -0.24999994) * fVar139
                         + 0.3333333) * fVar139 + -0.5) * fVar139 * fVar139) * -2.0);
            auVar135._8_4_ =
                 ~-(uint)(auVar177._8_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar125._8_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar91)) * 0.6931472 +
                         fVar141 +
                        (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984) *
                               fVar141 + -0.12420141) * fVar141 + 0.14249323) * fVar141 +
                            -0.16668057) * fVar141 + 0.20000714) * fVar141 + -0.24999994) * fVar141
                         + 0.3333333) * fVar141 + -0.5) * fVar141 * fVar141) * -2.0);
            auVar135._12_4_ =
                 ~-(uint)(auVar177._12_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar125._12_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar58 < 0.70710677) & (uint)fVar93)) * 0.6931472 + fVar90
                        + (((((((((fVar90 * 0.070376836 + -0.1151461) * fVar90 + 0.116769984) *
                                 fVar90 + -0.12420141) * fVar90 + 0.14249323) * fVar90 + -0.16668057
                              ) * fVar90 + 0.20000714) * fVar90 + -0.24999994) * fVar90 + 0.3333333)
                           * fVar90 + -0.5) * fVar90 * fVar90) * -2.0);
            auVar117._0_8_ =
                 CONCAT44(-(uint)(auVar177._4_4_ <= 0.0),-(uint)(auVar177._0_4_ <= 0.0)) &
                 0x7fffffff7fffffff;
            auVar117._8_4_ = -(uint)(auVar177._8_4_ <= 0.0) & 0x7fffffff;
            auVar117._12_4_ = -(uint)(auVar177._12_4_ <= 0.0) & 0x7fffffff;
            auVar125 = minps(auVar117 | auVar135,_DAT_004f0400);
            auVar125 = maxps(auVar125,_DAT_004f0410);
            fVar55 = auVar125._0_4_ * 1.442695 + 0.5;
            fVar56 = auVar125._4_4_ * 1.442695 + 0.5;
            fVar124 = auVar125._8_4_ * 1.442695 + 0.5;
            fVar139 = auVar125._12_4_ * 1.442695 + 0.5;
            fVar140 = (float)(int)fVar55;
            fVar141 = (float)(int)fVar56;
            fVar58 = (float)(int)fVar124;
            fVar90 = (float)(int)fVar139;
            fVar140 = fVar140 - (float)(-(uint)(fVar55 < fVar140) & (uint)fVar57);
            fVar141 = fVar141 - (float)(-(uint)(fVar56 < fVar141) & (uint)fVar89);
            fVar58 = fVar58 - (float)(-(uint)(fVar124 < fVar58) & (uint)fVar91);
            fVar90 = fVar90 - (float)(-(uint)(fVar139 < fVar90) & (uint)fVar93);
            fVar55 = auVar125._0_4_ - fVar140 * 0.6931472;
            fVar56 = auVar125._4_4_ - fVar141 * 0.6931472;
            fVar124 = auVar125._8_4_ - fVar58 * 0.6931472;
            fVar139 = auVar125._12_4_ - fVar90 * 0.6931472;
            auVar118._0_4_ =
                 fVar55 + fVar57 +
                 (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                   0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5) * fVar55 * fVar55;
            auVar118._4_4_ =
                 fVar56 + fVar89 +
                 (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                   0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5) * fVar56 * fVar56;
            auVar118._8_4_ =
                 fVar124 + fVar91 +
                 (((((fVar124 * 0.00019875691 + 0.0013981999) * fVar124 + 0.008333452) * fVar124 +
                   0.041665796) * fVar124 + 0.16666666) * fVar124 + 0.5) * fVar124 * fVar124;
            auVar118._12_4_ =
                 fVar139 + fVar93 +
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) * fVar139 * fVar139;
            fVar140 = (float)((int)fVar140 * 0x800000 + (int)fVar57) * auVar118._0_4_ + fVar57;
            fVar141 = (float)((int)fVar141 * 0x800000 + (int)fVar89) * auVar118._4_4_ + fVar89;
            fVar58 = (float)((int)fVar58 * 0x800000 + (int)fVar91) * auVar118._8_4_ + fVar91;
            fVar90 = (float)((int)fVar90 * 0x800000 + (int)fVar93) * auVar118._12_4_ + fVar93;
            auVar12._4_4_ = fVar141;
            auVar12._0_4_ = fVar140;
            auVar12._8_4_ = fVar58;
            auVar12._12_4_ = fVar90;
            auVar125 = rcpps(auVar118,auVar12);
            fVar55 = auVar125._0_4_;
            fVar56 = auVar125._4_4_;
            fVar124 = auVar125._8_4_;
            fVar139 = auVar125._12_4_;
            auVar179._0_4_ = fVar55 + fVar55 + -1.0 + (2.0 - fVar140 * (fVar55 + fVar55)) * fVar55;
            auVar179._4_4_ = fVar56 + fVar56 + -1.0 + (2.0 - fVar141 * (fVar56 + fVar56)) * fVar56;
            auVar179._8_4_ =
                 fVar124 + fVar124 + -1.0 + (2.0 - fVar58 * (fVar124 + fVar124)) * fVar124;
            auVar179._12_4_ =
                 fVar139 + fVar139 + -1.0 + (2.0 - fVar90 * (fVar139 + fVar139)) * fVar139;
            goto LAB_00276f75;
          case 6:
            fVar55 = **(float **)(&this->field_0xe8 + (long)p_Var7);
            fVar56 = (*(float **)(&this->field_0xe8 + (long)p_Var7))[1];
            auVar178._0_4_ = fVar55 * fVar41 + fVar56;
            auVar178._4_4_ = fVar55 * fVar54 + fVar56;
            auVar178._8_4_ = fVar55 * auVar80._8_4_ + fVar56;
            auVar178._12_4_ = fVar55 * auVar80._12_4_ + fVar56;
            auVar125 = maxps(auVar178,auVar125);
            auVar179 = minps(auVar125,auVar73);
LAB_00276f75:
            auVar175._0_4_ = auVar179._0_4_ * fVar41;
            auVar175._4_4_ = auVar179._4_4_ * fVar54;
            auVar175._8_4_ = auVar179._8_4_ * auVar80._8_4_;
            auVar175._12_4_ = auVar179._12_4_ * auVar80._12_4_;
          }
switchD_00276bec_caseD_1:
          *(undefined1 (*) [16])((long)top_blob->data + uVar25 * 0x10) = auVar175;
        }
      }
    }
  }
  if (local_c8 != (int *)0x0) {
    LOCK();
    *local_c8 = *local_c8 + -1;
    UNLOCK();
    if (*local_c8 == 0) {
      if (local_b0 == (Allocator *)0x0) {
        free(local_d0);
      }
      else {
        (*local_b0->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int InnerProduct_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}